

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O1

void __thiscall UnixMakefileGenerator::init2(UnixMakefileGenerator *this)

{
  QMakeProject **ppQVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char (*pacVar6) [4];
  Data *pDVar7;
  char16_t *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  char cVar14;
  bool bVar15;
  QList<ProString> *pQVar16;
  ProStringList *pPVar17;
  iterator iVar18;
  ProString *pPVar19;
  QString *str;
  pointer this_00;
  QMovableArrayOps<ProString> *pQVar20;
  QArrayDataPointer<ProString> *pQVar21;
  QArrayDataPointer<ProString> *pQVar22;
  qsizetype qVar23;
  ProStringList *pPVar24;
  char *pcVar25;
  QMakeProject *pQVar26;
  UnixMakefileGenerator *pUVar27;
  long in_FS_OFFSET;
  QByteArrayView QVar28;
  QLatin1String QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QAnyStringView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QLatin1String other;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  QStringView config_02;
  QLatin1String other_00;
  QStringView config_03;
  QStringView config_04;
  QStringView config_05;
  QStringView config_06;
  QStringView config_07;
  QStringView config_08;
  QStringView config_09;
  QStringView config_10;
  QStringView config_11;
  QStringView config_12;
  QStringView config_13;
  QStringView config_14;
  QStringView config_15;
  QStringView config_16;
  QLatin1String QVar43;
  ProString bundle_loc_1;
  ProString soname;
  ProString bundle_loc;
  ProString MD_flag;
  QList<ProString> *local_848;
  ProKey local_838;
  ProString local_808;
  ProKey local_7d8;
  ProString local_7a8;
  undefined1 local_778 [16];
  qsizetype local_768;
  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]> local_738;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
  local_6f8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
  local_688;
  undefined1 local_608 [40];
  undefined1 *puStack_5e0;
  ProString local_5d8 [2];
  undefined1 local_558 [40];
  undefined1 *puStack_530;
  ProString local_528;
  char (*local_4f8) [2];
  char (*local_4b0) [2];
  undefined1 local_4a8 [224];
  undefined1 local_3c8 [40];
  undefined1 *puStack_3a0;
  undefined1 local_398 [48];
  Data *local_368;
  ProString *local_360;
  char (*local_338) [2];
  Data *local_330;
  char (*local_320) [2];
  undefined1 local_2d8 [40];
  QMakeLocalFileName *pQStack_2b0;
  undefined1 local_2a8 [16];
  ProString local_298;
  char (*local_248) [2];
  undefined1 local_240 [136];
  ProString local_1b8;
  ProString local_188;
  ProString local_158;
  undefined1 local_128 [96];
  ProString local_c8;
  ProString local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar26 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_2d8,"QMAKE_FRAMEWORK_VERSION");
  bVar12 = QMakeProject::isEmpty(pQVar26,(ProKey *)local_2d8);
  if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
    LOCK();
    *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
             _vptr_QMakeSourceFileInfo =
         *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                  _vptr_QMakeSourceFileInfo + -1;
    UNLOCK();
    if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo == 0) {
      QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
    }
  }
  ppQVar1 = &(this->super_MakefileGenerator).project;
  if (bVar12) {
    pQVar26 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_2d8,"QMAKE_FRAMEWORK_VERSION");
    pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8)->
               super_QList<ProString>;
    pQVar26 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_4a8,"VER_MAJ");
    QMakeEvaluator::first((ProString *)local_3c8,&pQVar26->super_QMakeEvaluator,(ProKey *)local_4a8)
    ;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_3c8);
    QList<ProString>::end(pQVar16);
    if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
      }
    }
    if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
      }
    }
  }
  pQVar26 = *ppQVar1;
  ProKey::ProKey((ProKey *)local_3c8,"TEMPLATE");
  QMakeEvaluator::first((ProString *)local_2d8,&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
  bVar12 = ProString::operator==((ProString *)local_2d8,"aux");
  if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
    LOCK();
    *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
             _vptr_QMakeSourceFileInfo =
         *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                  _vptr_QMakeSourceFileInfo + -1;
    UNLOCK();
    if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo == 0) {
      QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
    }
  }
  if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
    LOCK();
    *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
             _vptr_QMakeSourceFileInfo =
         *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                  _vptr_QMakeSourceFileInfo + -1;
    UNLOCK();
    if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo == 0) {
      QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
    }
  }
  if (bVar12) {
    pQVar26 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_558,"QMAKE_PREFIX_STATICLIB");
    QMakeEvaluator::first((ProString *)local_4a8,&pQVar26->super_QMakeEvaluator,(ProKey *)local_558)
    ;
    pQVar26 = *ppQVar1;
    ProKey::ProKey((ProKey *)&local_688,"TARGET");
    QMakeEvaluator::first
              ((ProString *)local_608,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_688);
    ProString::ProString((ProString *)local_2d8,(ProString *)local_4a8);
    ProString::ProString((ProString *)local_2a8,(ProString *)local_608);
    ProString::ProString<ProString,ProString>
              ((ProString *)local_3c8,(QStringBuilder<ProString,_ProString> *)local_2d8);
    local_778._0_8_ = (Data *)0x0;
    local_778._8_8_ = (ProString *)0x0;
    local_768 = 0;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
              ((QMovableArrayOps<ProString> *)local_778,0,(ProString *)local_3c8);
    QList<ProString>::end((QList<ProString> *)local_778);
    pQVar26 = *ppQVar1;
    ProKey::ProKey((ProKey *)&local_6f8,"PRL_TARGET");
    pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)&local_6f8);
    qVar23 = local_768;
    uVar5 = local_778._8_8_;
    uVar4 = local_778._0_8_;
    local_778._0_8_ = (QArrayData *)0x0;
    local_778._8_8_ = (ProString *)0x0;
    local_768 = 0;
    local_738.a.a = (char (*) [4])(pPVar17->super_QList<ProString>).d.d;
    local_738.a.b.m_string.d.d = (Data *)(pPVar17->super_QList<ProString>).d.ptr;
    (pPVar17->super_QList<ProString>).d.d = (Data *)uVar4;
    (pPVar17->super_QList<ProString>).d.ptr = (ProString *)uVar5;
    local_738.a.b.m_string.d.ptr = (char16_t *)(pPVar17->super_QList<ProString>).d.size;
    (pPVar17->super_QList<ProString>).d.size = qVar23;
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_738);
    if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_778);
    if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    QStringBuilder<ProString,_ProString>::~QStringBuilder
              ((QStringBuilder<ProString,_ProString> *)local_2d8);
    if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
      }
    }
    if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
      }
    }
    if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
      }
    }
    if ((UnixMakefileGenerator *)local_558._0_8_ == (UnixMakefileGenerator *)0x0) goto LAB_001d94f5;
    LOCK();
    ((__atomic_base<int> *)
    &(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo)
    ->_M_i = ((__atomic_base<int> *)
             &(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
              _vptr_QMakeSourceFileInfo)->_M_i + -1;
    iVar2 = ((__atomic_base<int> *)
            &(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
             _vptr_QMakeSourceFileInfo)->_M_i;
    UNLOCK();
    pUVar27 = (UnixMakefileGenerator *)local_558._0_8_;
joined_r0x001da32f:
    if (iVar2 == 0) {
      QArrayData::deallocate((QArrayData *)pUVar27,2,0x10);
    }
  }
  else {
    pQVar26 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_2d8,"QMAKE_APP_FLAG");
    pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
    lVar3 = (pPVar17->super_QList<ProString>).d.size;
    if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
      }
    }
    pQVar26 = *ppQVar1;
    if (lVar3 == 0) {
      QVar28.m_data = (storage_type *)0x9;
      QVar28.m_size = (qsizetype)local_2d8;
      QString::fromUtf8(QVar28);
      uVar4 = local_2d8._0_8_;
      config.m_data = (storage_type_conflict *)local_2d8._8_8_;
      config.m_size = local_2d8._16_8_;
      bVar12 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config,false);
      if ((UnixMakefileGenerator *)uVar4 != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo
             = *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
        }
      }
      if (bVar12) {
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"TARGET");
        pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8)->
                   super_QList<ProString>;
        iVar18 = QList<ProString>::begin(pQVar16);
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_4a8,"QMAKE_PREFIX_STATICLIB");
        QMakeEvaluator::first
                  ((ProString *)local_3c8,&pQVar26->super_QMakeEvaluator,(ProKey *)local_4a8);
        pPVar19 = ProString::prepend(iVar18.i,(ProString *)local_3c8);
        local_688.a.a.a.a = (char (*) [4])0x0;
        local_688.a.a.a.b.m_string.d.d = (Data *)0x0;
        local_688.a.a.a.b.m_string.d.ptr = (char16_t *)0x0;
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                  ((QMovableArrayOps<ProString> *)&local_688,0,pPVar19);
        QList<ProString>::end((QList<ProString> *)&local_688);
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_558,"PRL_TARGET");
        pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_558);
        pcVar8 = local_688.a.a.a.b.m_string.d.ptr;
        pDVar7 = local_688.a.a.a.b.m_string.d.d;
        pacVar6 = local_688.a.a.a.a;
        local_688.a.a.a.a = (char (*) [4])0x0;
        local_688.a.a.a.b.m_string.d.d = (Data *)0x0;
        local_688.a.a.a.b.m_string.d.ptr = (char16_t *)0x0;
        local_608._0_8_ = (pPVar17->super_QList<ProString>).d.d;
        local_608._8_8_ = (pPVar17->super_QList<ProString>).d.ptr;
        (pPVar17->super_QList<ProString>).d.d = (Data *)pacVar6;
        (pPVar17->super_QList<ProString>).d.ptr = (ProString *)pDVar7;
        local_608._16_8_ = (pPVar17->super_QList<ProString>).d.size;
        (pPVar17->super_QList<ProString>).d.size = (qsizetype)pcVar8;
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_608);
        if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
          }
        }
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_688)
        ;
        if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_4a8,"QMAKE_EXTENSION_STATICLIB");
        QMakeEvaluator::first
                  ((ProString *)local_3c8,&pQVar26->super_QMakeEvaluator,(ProKey *)local_4a8);
        local_2d8._0_8_ = ".";
        ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)local_3c8);
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_558,"TARGET");
        pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_558)->
                   super_QList<ProString>;
        iVar18 = QList<ProString>::begin(pQVar16);
        ProString::operator+=(iVar18.i,(QStringBuilder<const_char_(&)[2],_ProString> *)local_2d8);
        if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_2d8._8_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._8_8_,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
          }
        }
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"QMAKE_AR_CMD");
        pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
        lVar3 = (pPVar17->super_QList<ProString>).d.size;
        if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        if (lVar3 == 0) {
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)local_2d8,"QMAKE_AR_CMD");
          pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8)->
                     super_QList<ProString>;
          ProString::ProString((ProString *)local_3c8,"$(AR) $(DESTDIR)$(TARGET) $(OBJECTS)");
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_3c8
                    );
          QList<ProString>::end(pQVar16);
          if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
            }
          }
          goto joined_r0x001d35bc;
        }
      }
      else {
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_608,"TARGETA");
        pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_608)->
                   super_QList<ProString>;
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_738,"DESTDIR");
        QMakeEvaluator::first
                  ((ProString *)&local_6f8,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_738);
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_68,"QMAKE_PREFIX_STATICLIB");
        QMakeEvaluator::first
                  ((ProString *)local_778,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_68);
        ProString::ProString((ProString *)local_558,(ProString *)&local_6f8);
        ProString::ProString(&local_528,(ProString *)local_778);
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_c8,"TARGET");
        QMakeEvaluator::first(&local_98,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_c8);
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_4a8,
                   (QStringBuilder<ProString,_ProString> *)local_558,&local_98);
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_3c8,
                   (QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_4a8);
        local_338 = (char (*) [2])0x2b339e;
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_128,"QMAKE_EXTENSION_STATICLIB");
        QMakeEvaluator::first
                  ((ProString *)(local_128 + 0x30),&pQVar26->super_QMakeEvaluator,
                   (ProKey *)local_128);
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_2d8,
                   (QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_3c8);
        local_248 = local_338;
        ProString::ProString((ProString *)local_240,(ProString *)(local_128 + 0x30));
        ProString::
        ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,ProString>,ProString>,char_const(&)[2]>,ProString>
                  ((ProString *)&local_688,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>,_ProString>
                    *)local_2d8);
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)&local_688)
        ;
        QList<ProString>::end(pQVar16);
        if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
          }
        }
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>,_ProString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_2d8);
        if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_128._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
          }
        }
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_3c8);
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_4a8);
        if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QStringBuilder<ProString,_ProString>::~QStringBuilder
                  ((QStringBuilder<ProString,_ProString> *)local_558);
        if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                   super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                        super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                       super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
          }
        }
        if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
          }
        }
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"QMAKE_AR_CMD");
        pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8)->
                   super_QList<ProString>;
        if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        if ((pQVar16->d).size == 0) {
          ProString::ProString((ProString *)local_2d8,"$(AR) $(TARGETA) $(OBJECTS)");
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_2d8
                    );
          QList<ProString>::end(pQVar16);
          if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            ((__atomic_base<int> *)
            &(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
             _vptr_QMakeSourceFileInfo)->_M_i =
                 ((__atomic_base<int> *)
                 &(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                  _vptr_QMakeSourceFileInfo)->_M_i + -1;
            iVar2 = ((__atomic_base<int> *)
                    &(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo)->_M_i;
            UNLOCK();
            pUVar27 = (UnixMakefileGenerator *)local_2d8._0_8_;
            goto joined_r0x001d3a88;
          }
        }
        else {
          ProString::toQString((QString *)local_3c8,(pQVar16->d).ptr);
          QVar29.m_data = &DAT_00000008;
          QVar29.m_size = (qsizetype)local_3c8;
          QVar43.m_data = (char *)0x9;
          QVar43.m_size = (qsizetype)"(TARGET)";
          str = (QString *)QString::replace(QVar29,QVar43,0x2ab057);
          ProString::ProString((ProString *)local_2d8,str);
          this_00 = QList<ProString>::data(pQVar16);
          QString::operator=(&this_00->m_string,(QString *)local_2d8);
          this_00->m_hash = (size_t)pQStack_2b0;
          this_00->m_offset = local_2d8._24_4_;
          this_00->m_length = local_2d8._28_4_;
          *(undefined8 *)&this_00->m_file = local_2d8._32_8_;
          if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            ((__atomic_base<int> *)
            &(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
             _vptr_QMakeSourceFileInfo)->_M_i =
                 ((__atomic_base<int> *)
                 &(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                  _vptr_QMakeSourceFileInfo)->_M_i + -1;
            iVar2 = ((__atomic_base<int> *)
                    &(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo)->_M_i;
            UNLOCK();
            pUVar27 = (UnixMakefileGenerator *)local_3c8._0_8_;
joined_r0x001d3a88:
            if (iVar2 == 0) {
              QArrayData::deallocate((QArrayData *)pUVar27,2,0x10);
            }
          }
        }
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"QMAKE_BUNDLE");
        bVar12 = QMakeProject::isEmpty(pQVar26,(ProKey *)local_2d8);
        if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        pQVar26 = *ppQVar1;
        if (bVar12) {
          QVar30.m_data = (storage_type *)0x6;
          QVar30.m_size = (qsizetype)local_2d8;
          QString::fromUtf8(QVar30);
          uVar4 = local_2d8._0_8_;
          config_00.m_data = (storage_type_conflict *)local_2d8._8_8_;
          config_00.m_size = local_2d8._16_8_;
          bVar12 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config_00,false);
          if ((UnixMakefileGenerator *)uVar4 != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
            }
          }
          if (bVar12) {
            local_128._0_8_ = (UnixMakefileGenerator *)0x0;
            local_128._8_8_ = (SourceFiles *)0x0;
            local_128._16_8_ = (SourceFiles *)0x0;
            pQVar26 = *ppQVar1;
            QVar31.m_data = (storage_type *)0x15;
            QVar31.m_size = (qsizetype)local_2d8;
            QString::fromUtf8(QVar31);
            config_01.m_data = (storage_type_conflict *)local_2d8._8_8_;
            config_01.m_size = local_2d8._16_8_;
            bVar12 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config_01,false);
            if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            if (!bVar12) {
              QVar32.m_size = (size_t)"lib";
              QVar32.field_0.m_data = local_128;
              QString::assign(QVar32);
            }
            pQVar26 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_3c8,"PRL_TARGET");
            pQVar20 = (QMovableArrayOps<ProString> *)
                      QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
            pQVar26 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_608,"TARGET");
            QMakeEvaluator::first
                      ((ProString *)local_558,&pQVar26->super_QMakeEvaluator,(ProKey *)local_608);
            local_2d8._0_8_ = (UnixMakefileGenerator *)local_128;
            ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)local_558);
            ProString::ProString<QString&,ProString>
                      ((ProString *)local_4a8,(QStringBuilder<QString_&,_ProString> *)local_2d8);
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                      (pQVar20,0,(ProString *)local_4a8);
            if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
              }
            }
            if ((QArrayData *)local_2d8._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_2d8._8_8_,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
              }
            }
            pQVar26 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_558,"TARGET_x.y.z");
            pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_558)
                       ->super_QList<ProString>;
            pQVar26 = *ppQVar1;
            ProKey::ProKey((ProKey *)&local_6f8,"TARGET");
            QMakeEvaluator::first
                      ((ProString *)&local_688,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_6f8);
            local_4a8._0_8_ = (UnixMakefileGenerator *)local_128;
            ProString::ProString((ProString *)(local_4a8 + 8),(ProString *)&local_688);
            local_3c8._0_8_ = local_4a8._0_8_;
            ProString::ProString((ProString *)(local_3c8 + 8),(ProString *)(local_4a8 + 8));
            local_398._8_8_ = ".";
            pQVar26 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_778,"QMAKE_EXTENSION_PLUGIN");
            QMakeEvaluator::first
                      ((ProString *)&local_738,&pQVar26->super_QMakeEvaluator,(ProKey *)local_778);
            local_2d8._0_8_ = local_3c8._0_8_;
            ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)(local_3c8 + 8));
            local_2a8._8_8_ = local_398._8_8_;
            ProString::ProString(&local_298,(ProString *)&local_738);
            ProString::
            ProString<QStringBuilder<QStringBuilder<QString&,ProString>,char_const(&)[2]>,ProString>
                      ((ProString *)local_608,
                       (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                        *)local_2d8);
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                      ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,
                       (ProString *)local_608);
            QList<ProString>::end(pQVar16);
            if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
              }
            }
            QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)local_2d8);
            if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
              }
            }
            if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
              }
            }
            if ((QArrayData *)local_3c8._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_3c8._8_8_,2,0x10);
              }
            }
            if ((QArrayData *)local_4a8._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_4a8._8_8_,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
              }
            }
            pQVar26 = *ppQVar1;
            QVar33.m_data = (storage_type *)0x11;
            QVar33.m_size = (qsizetype)local_2d8;
            QString::fromUtf8(QVar33);
            uVar4 = local_2d8._0_8_;
            config_02.m_data = (storage_type_conflict *)local_2d8._8_8_;
            config_02.m_size = local_2d8._16_8_;
            bVar12 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config_02,false);
            if ((UnixMakefileGenerator *)uVar4 != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
              }
            }
            pQVar26 = *ppQVar1;
            if (bVar12) {
              ProKey::ProKey((ProKey *)&local_688,"TARGET_x");
              pQVar16 = &QMakeEvaluator::valuesRef
                                   (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_688)->
                         super_QList<ProString>;
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_778,"TARGET");
              QMakeEvaluator::first
                        ((ProString *)&local_738,&pQVar26->super_QMakeEvaluator,(ProKey *)local_778)
              ;
              local_608._0_8_ = local_128;
              ProString::ProString((ProString *)(local_608 + 8),(ProString *)&local_738);
              local_558._0_8_ = local_608._0_8_;
              ProString::ProString((ProString *)(local_558 + 8),(ProString *)(local_608 + 8));
              local_528.m_string.d.ptr = L".";
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_98,"VER_MAJ");
              QMakeEvaluator::first(&local_68,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_98);
              operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                         *)local_4a8,
                        (QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]> *)
                        local_558,&local_68);
              operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                         *)local_3c8,
                        (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                         *)local_4a8,(char (*) [2])0x2b339e);
              pQVar26 = *ppQVar1;
              pcVar25 = "QMAKE_EXTENSION_PLUGIN";
            }
            else {
              ProKey::ProKey((ProKey *)&local_688,"TARGET_x");
              pQVar16 = &QMakeEvaluator::valuesRef
                                   (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_688)->
                         super_QList<ProString>;
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_778,"TARGET");
              QMakeEvaluator::first
                        ((ProString *)&local_738,&pQVar26->super_QMakeEvaluator,(ProKey *)local_778)
              ;
              local_608._0_8_ = local_128;
              ProString::ProString((ProString *)(local_608 + 8),(ProString *)&local_738);
              local_558._0_8_ = local_608._0_8_;
              ProString::ProString((ProString *)(local_558 + 8),(ProString *)(local_608 + 8));
              local_528.m_string.d.ptr = L".";
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_98,"QMAKE_EXTENSION_PLUGIN");
              QMakeEvaluator::first(&local_68,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_98);
              operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                         *)local_4a8,
                        (QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]> *)
                        local_558,&local_68);
              operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                         *)local_3c8,
                        (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                         *)local_4a8,(char (*) [2])0x2b339e);
              pQVar26 = *ppQVar1;
              pcVar25 = "VER_MAJ";
            }
            ProKey::ProKey((ProKey *)(local_128 + 0x30),pcVar25);
            QMakeEvaluator::first
                      (&local_c8,&pQVar26->super_QMakeEvaluator,(ProKey *)(local_128 + 0x30));
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
            ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)local_2d8,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                              *)local_3c8,&local_c8);
            ProString::
            ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString&,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                      ((ProString *)&local_6f8,
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                        *)local_2d8);
            QList<ProString>::append(pQVar16,(rvalue_ref)&local_6f8);
            if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
              }
            }
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)local_2d8);
            if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
              }
            }
            QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)local_3c8);
            QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)local_4a8);
            if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                       super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                            super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                           super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((QArrayData *)local_558._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_558._8_8_,2,0x10);
              }
            }
            if ((ProString *)local_608._8_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_608._8_8_)->d).d =
                   *(int *)&(((QString *)local_608._8_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_608._8_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_608._8_8_,2,0x10);
              }
            }
            if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
              }
            }
            if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
              }
            }
            pQVar26 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_2d8,"TARGET_x.y.z");
            pQVar21 = (QArrayDataPointer<ProString> *)
                      QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
            pQVar26 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_3c8,"TARGET");
            pQVar22 = (QArrayDataPointer<ProString> *)
                      QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
            QArrayDataPointer<ProString>::operator=(pQVar22,pQVar21);
            if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_128._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              ((__atomic_base<int> *)
              &(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo)->_M_i =
                   ((__atomic_base<int> *)
                   &(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo)->_M_i + -1;
              iVar2 = ((__atomic_base<int> *)
                      &(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo)->_M_i;
              UNLOCK();
              pUVar27 = (UnixMakefileGenerator *)local_128._0_8_;
              goto joined_r0x001d59e9;
            }
          }
          else {
            pQVar26 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_2d8,"QMAKE_HPUX_SHLIB");
            bVar12 = QMakeProject::isEmpty(pQVar26,(ProKey *)local_2d8);
            if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            pQVar26 = *ppQVar1;
            if (bVar12) {
              ProKey::ProKey((ProKey *)local_2d8,"QMAKE_AIX_SHLIB");
              bVar12 = QMakeProject::isEmpty(pQVar26,(ProKey *)local_2d8);
              if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
              pQVar26 = *ppQVar1;
              if (!bVar12) {
                ProKey::ProKey((ProKey *)local_3c8,"PRL_TARGET");
                pQVar20 = (QMovableArrayOps<ProString> *)
                          QMakeEvaluator::valuesRef
                                    (&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)local_608,"TARGET");
                QMakeEvaluator::first
                          ((ProString *)local_558,&pQVar26->super_QMakeEvaluator,(ProKey *)local_608
                          );
                local_2d8._0_8_ = "lib";
                ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)local_558);
                ProString::ProString<char_const(&)[4],ProString>
                          ((ProString *)local_4a8,
                           (QStringBuilder<const_char_(&)[4],_ProString> *)local_2d8);
                QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                          (pQVar20,0,(ProString *)local_4a8);
                if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                                _vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
                  }
                }
                if ((QArrayData *)local_2d8._8_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_2d8._8_8_,2,0x10);
                  }
                }
                if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                                _vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
                  }
                }
                if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                                _vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                  }
                }
                if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                                _vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
                  }
                }
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)local_558,"TARGET_");
                pQVar16 = &QMakeEvaluator::valuesRef
                                     (&pQVar26->super_QMakeEvaluator,(ProKey *)local_558)->
                           super_QList<ProString>;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_6f8,"QMAKE_PREFIX_STATICLIB");
                QMakeEvaluator::first
                          ((ProString *)&local_688,&pQVar26->super_QMakeEvaluator,
                           (ProKey *)&local_6f8);
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)local_778,"TARGET");
                QMakeEvaluator::first
                          ((ProString *)&local_738,&pQVar26->super_QMakeEvaluator,
                           (ProKey *)local_778);
                ProString::ProString((ProString *)local_4a8,(ProString *)&local_688);
                ProString::ProString((ProString *)(local_4a8 + 0x30),(ProString *)&local_738);
                ProString::ProString((ProString *)local_3c8,(ProString *)local_4a8);
                ProString::ProString((ProString *)local_398,(ProString *)(local_4a8 + 0x30));
                local_368 = (Data *)0x2b339e;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_98,"QMAKE_EXTENSION_STATICLIB");
                QMakeEvaluator::first(&local_68,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_98);
                QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_2d8,
                                 (QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>
                                  *)local_3c8,&local_68);
                ProString::
                ProString<QStringBuilder<QStringBuilder<ProString,ProString>,char_const(&)[2]>,ProString>
                          ((ProString *)local_608,
                           (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)local_2d8);
                QList<ProString>::append(pQVar16,(ProString *)local_608);
                if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                                _vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_2d8);
                if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0)
                {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                           super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                                super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                               super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<ProString,_ProString>::~QStringBuilder
                          ((QStringBuilder<ProString,_ProString> *)local_3c8);
                QStringBuilder<ProString,_ProString>::~QStringBuilder
                          ((QStringBuilder<ProString,_ProString> *)local_4a8);
                if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                  }
                }
                if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                  }
                }
                if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->
                                super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo
                               )._vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                  }
                }
                if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo)
                                ._vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                  }
                }
                if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                                _vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
                  }
                }
                pQVar26 = *ppQVar1;
                QString::QString((QString *)local_2d8,"lib_version_first");
                config_06.m_data = (storage_type_conflict *)local_2d8._8_8_;
                config_06.m_size = local_2d8._16_8_;
                bVar12 = QMakeEvaluator::isActiveConfig
                                   (&pQVar26->super_QMakeEvaluator,config_06,false);
                if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                                _vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                  }
                }
                pQVar26 = *ppQVar1;
                if (bVar12) {
                  ProKey::ProKey((ProKey *)&local_688,"TARGET_x");
                  pQVar16 = &QMakeEvaluator::valuesRef
                                       (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_688)->
                             super_QList<ProString>;
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)local_778,"TARGET");
                  QMakeEvaluator::first
                            ((ProString *)&local_738,&pQVar26->super_QMakeEvaluator,
                             (ProKey *)local_778);
                  local_608._0_8_ = "lib";
                  ProString::ProString((ProString *)(local_608 + 8),(ProString *)&local_738);
                  local_558._0_8_ = local_608._0_8_;
                  ProString::ProString((ProString *)(local_558 + 8),(ProString *)(local_608 + 8));
                  local_528.m_string.d.ptr = L".";
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"VER_MAJ");
                  QMakeEvaluator::first
                            (&local_68,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_98);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,
                            (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                             *)local_558,&local_68);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_3c8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,(char (*) [2])0x2b339e);
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)(local_128 + 0x30),"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar26->super_QMakeEvaluator,(ProKey *)(local_128 + 0x30));
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_2d8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)local_3c8,&local_c8);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)&local_6f8,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)local_2d8);
                  QList<ProString>::append(pQVar16,(rvalue_ref)&local_6f8);
                  if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
                    LOCK();
                    *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo =
                         *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->
                                  super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                    UNLOCK();
                    if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo
                                 )._vptr_QMakeSourceFileInfo == 0) {
                      QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_2d8);
                  if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i
                         = (((QBasicAtomicInt *)local_128._48_8_)->_q_value).
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_3c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_4a8);
                  if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0
                     ) {
                    LOCK();
                    *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                             super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                         *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)
                                  ->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                    UNLOCK();
                    if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)
                                 ->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_558._8_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_558._8_8_,2,0x10);
                    }
                  }
                  if ((ProString *)local_608._8_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)local_608._8_8_)->d).d =
                         *(int *)&(((QString *)local_608._8_8_)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)local_608._8_8_)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_608._8_8_,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                    }
                  }
                  if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
                    LOCK();
                    *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo =
                         *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->
                                  super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                    UNLOCK();
                    if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->
                                 super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                      QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                    }
                  }
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_738,"TARGET_x.y");
                  pQVar16 = &QMakeEvaluator::valuesRef
                                       (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_738)->
                             super_QList<ProString>;
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"TARGET");
                  QMakeEvaluator::first
                            (&local_68,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_98);
                  pPVar19 = &local_6f8.a.a.b;
                  local_6f8.a.a.a = (char (*) [4])0x2b05f0;
                  ProString::ProString(pPVar19,&local_68);
                  local_688.a.a.a.a = local_6f8.a.a.a;
                  ProString::ProString(&local_688.a.a.a.b,pPVar19);
                  local_688.a.a.b = (char (*) [2])0x2b339e;
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)(local_128 + 0x30),"VER_MAJ");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar26->super_QMakeEvaluator,(ProKey *)(local_128 + 0x30));
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_608,
                            (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                             *)&local_688,&local_c8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_558,
                            (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_608,(char (*) [2])0x2b339e);
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_158,"VER_MIN");
                  QMakeEvaluator::first
                            ((ProString *)local_128,&pQVar26->super_QMakeEvaluator,
                             (ProKey *)&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_4a8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)local_558,(ProString *)local_128);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_3c8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_4a8);
                  local_320 = (char (*) [2])0x2b339e;
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_1b8,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first
                            (&local_188,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_1b8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_2d8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_3c8,&local_188);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)local_778,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)local_2d8);
                  QList<ProString>::append(pQVar16,(ProString *)local_778);
                  if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_2d8);
                  if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_1b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_1b8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_3c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_4a8);
                  if ((UnixMakefileGenerator *)local_128._0_8_ != (UnixMakefileGenerator *)0x0) {
                    LOCK();
                    *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo =
                         *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo
                                  )._vptr_QMakeSourceFileInfo + -1;
                    UNLOCK();
                    if (*(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo)
                                 ._vptr_QMakeSourceFileInfo == 0) {
                      QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
                    }
                  }
                  if (&(local_158.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_158.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_558);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_608);
                  if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i
                         = (((QBasicAtomicInt *)local_128._48_8_)->_q_value).
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
                    }
                  }
                  if (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate
                                (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate
                                (&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0
                     ) {
                    LOCK();
                    *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                             super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                         *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)
                                  ->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                    UNLOCK();
                    if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)
                                 ->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                    }
                  }
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_68,"TARGET_x.y.z");
                  local_848 = &QMakeEvaluator::valuesRef
                                         (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_68)->
                               super_QList<ProString>;
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)(local_128 + 0x30),"TARGET");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar26->super_QMakeEvaluator,(ProKey *)(local_128 + 0x30));
                  local_778._0_8_ = "lib";
                  ProString::ProString((ProString *)(local_778 + 8),&local_c8);
                  local_738.a.a = (char (*) [4])local_778._0_8_;
                  ProString::ProString(&local_738.a.b,(ProString *)(local_778 + 8));
                  local_738.b = (char (*) [2])0x2b339e;
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_158,"VER_MAJ");
                  QMakeEvaluator::first
                            ((ProString *)local_128,&pQVar26->super_QMakeEvaluator,
                             (ProKey *)&local_158);
                  operator+(&local_6f8,&local_738,(ProString *)local_128);
                  operator+(&local_688,&local_6f8,(char (*) [2])0x2b339e);
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_1b8,"VER_MIN");
                  QMakeEvaluator::first
                            (&local_188,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_608,&local_688,&local_188);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_558,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_608);
                  local_4b0 = (char (*) [2])0x2b339e;
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey(&local_7d8,"VER_PAT");
                  QMakeEvaluator::first(&local_7a8,&pQVar26->super_QMakeEvaluator,&local_7d8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_558,&local_7a8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_3c8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,(char (*) [2])0x2b339e);
                  pQVar26 = *ppQVar1;
                  pcVar25 = "QMAKE_EXTENSION_SHLIB";
                }
                else {
                  ProKey::ProKey((ProKey *)&local_688,"TARGET_x");
                  pQVar16 = &QMakeEvaluator::valuesRef
                                       (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_688)->
                             super_QList<ProString>;
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)local_778,"TARGET");
                  QMakeEvaluator::first
                            ((ProString *)&local_738,&pQVar26->super_QMakeEvaluator,
                             (ProKey *)local_778);
                  local_608._0_8_ = "lib";
                  ProString::ProString((ProString *)(local_608 + 8),(ProString *)&local_738);
                  local_558._0_8_ = local_608._0_8_;
                  ProString::ProString((ProString *)(local_558 + 8),(ProString *)(local_608 + 8));
                  local_528.m_string.d.ptr = L".";
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first
                            (&local_68,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_98);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,
                            (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                             *)local_558,&local_68);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_3c8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,(char (*) [2])0x2b339e);
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)(local_128 + 0x30),"VER_MAJ");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar26->super_QMakeEvaluator,(ProKey *)(local_128 + 0x30));
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_2d8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)local_3c8,&local_c8);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)&local_6f8,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)local_2d8);
                  QList<ProString>::append(pQVar16,(rvalue_ref)&local_6f8);
                  if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
                    LOCK();
                    *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo =
                         *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->
                                  super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                    UNLOCK();
                    if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo
                                 )._vptr_QMakeSourceFileInfo == 0) {
                      QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_2d8);
                  if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i
                         = (((QBasicAtomicInt *)local_128._48_8_)->_q_value).
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_3c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_4a8);
                  if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0
                     ) {
                    LOCK();
                    *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                             super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                         *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)
                                  ->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                    UNLOCK();
                    if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)
                                 ->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_558._8_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_558._8_8_,2,0x10);
                    }
                  }
                  if ((ProString *)local_608._8_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)local_608._8_8_)->d).d =
                         *(int *)&(((QString *)local_608._8_8_)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)local_608._8_8_)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_608._8_8_,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                    }
                  }
                  if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
                    LOCK();
                    *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo =
                         *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->
                                  super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                    UNLOCK();
                    if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->
                                 super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                      QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                    }
                  }
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_738,"TARGET_x.y");
                  pQVar16 = &QMakeEvaluator::valuesRef
                                       (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_738)->
                             super_QList<ProString>;
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"TARGET");
                  QMakeEvaluator::first
                            (&local_68,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_98);
                  pPVar19 = &local_6f8.a.a.b;
                  local_6f8.a.a.a = (char (*) [4])0x2b05f0;
                  ProString::ProString(pPVar19,&local_68);
                  local_688.a.a.a.a = local_6f8.a.a.a;
                  ProString::ProString(&local_688.a.a.a.b,pPVar19);
                  local_688.a.a.b = (char (*) [2])0x2b339e;
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)(local_128 + 0x30),"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar26->super_QMakeEvaluator,(ProKey *)(local_128 + 0x30));
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_608,
                            (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                             *)&local_688,&local_c8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_558,
                            (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_608,(char (*) [2])0x2b339e);
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_158,"VER_MAJ");
                  QMakeEvaluator::first
                            ((ProString *)local_128,&pQVar26->super_QMakeEvaluator,
                             (ProKey *)&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_4a8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)local_558,(ProString *)local_128);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_3c8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_4a8);
                  local_320 = (char (*) [2])0x2b339e;
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_1b8,"VER_MIN");
                  QMakeEvaluator::first
                            (&local_188,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_1b8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_2d8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_3c8,&local_188);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)local_778,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)local_2d8);
                  QList<ProString>::append(pQVar16,(ProString *)local_778);
                  if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_2d8);
                  if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_1b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_1b8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_3c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_4a8);
                  if ((UnixMakefileGenerator *)local_128._0_8_ != (UnixMakefileGenerator *)0x0) {
                    LOCK();
                    *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo =
                         *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo
                                  )._vptr_QMakeSourceFileInfo + -1;
                    UNLOCK();
                    if (*(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo)
                                 ._vptr_QMakeSourceFileInfo == 0) {
                      QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
                    }
                  }
                  if (&(local_158.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_158.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_558);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_608);
                  if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i
                         = (((QBasicAtomicInt *)local_128._48_8_)->_q_value).
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
                    }
                  }
                  if (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate
                                (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate
                                (&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0
                     ) {
                    LOCK();
                    *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                             super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                         *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)
                                  ->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                    UNLOCK();
                    if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)
                                 ->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                    }
                  }
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_68,"TARGET_x.y.z");
                  local_848 = &QMakeEvaluator::valuesRef
                                         (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_68)->
                               super_QList<ProString>;
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)(local_128 + 0x30),"TARGET");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar26->super_QMakeEvaluator,(ProKey *)(local_128 + 0x30));
                  local_778._0_8_ = "lib";
                  ProString::ProString((ProString *)(local_778 + 8),&local_c8);
                  local_738.a.a = (char (*) [4])local_778._0_8_;
                  ProString::ProString(&local_738.a.b,(ProString *)(local_778 + 8));
                  local_738.b = (char (*) [2])0x2b339e;
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_158,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first
                            ((ProString *)local_128,&pQVar26->super_QMakeEvaluator,
                             (ProKey *)&local_158);
                  operator+(&local_6f8,&local_738,(ProString *)local_128);
                  operator+(&local_688,&local_6f8,(char (*) [2])0x2b339e);
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_1b8,"VER_MAJ");
                  QMakeEvaluator::first
                            (&local_188,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_608,&local_688,&local_188);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_558,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_608);
                  local_4b0 = (char (*) [2])0x2b339e;
                  pQVar26 = *ppQVar1;
                  ProKey::ProKey(&local_7d8,"VER_MIN");
                  QMakeEvaluator::first(&local_7a8,&pQVar26->super_QMakeEvaluator,&local_7d8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_558,&local_7a8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_3c8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,(char (*) [2])0x2b339e);
                  pQVar26 = *ppQVar1;
                  pcVar25 = "VER_PAT";
                }
                ProKey::ProKey(&local_838,pcVar25);
                QMakeEvaluator::first(&local_808,&pQVar26->super_QMakeEvaluator,&local_838);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_2d8,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                  *)local_3c8,&local_808);
                ProString::
                ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                          (&local_98,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)local_2d8);
                QList<ProString>::append(local_848,&local_98);
                if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_2d8);
                if (&(local_808.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_808.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_838.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0
                   ) {
                  LOCK();
                  ((local_838.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_838.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_838.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_838.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_3c8);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_4a8);
                if (&(local_7a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_7a8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_7d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0
                   ) {
                  LOCK();
                  ((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_7d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_558);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_608);
                if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_1b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_1b8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder(&local_688.a);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder(&local_6f8);
                if ((UnixMakefileGenerator *)local_128._0_8_ != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                                _vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
                  }
                }
                if (&(local_158.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_158.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((ProString *)local_738.a.b.m_string.d.d != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_738.a.b.m_string.d.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_738.a.b.m_string.d.d)->super_QArrayData)->d).d
                       + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)&(local_738.a.b.m_string.d.d)->super_QArrayData)->d).d
                      == 0) {
                    QArrayData::deallocate(&(local_738.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((ProString *)local_778._8_8_ != (ProString *)0x0) {
                  LOCK();
                  ((__atomic_base<int> *)&(((QString *)local_778._8_8_)->d).d)->_M_i =
                       ((__atomic_base<int> *)&(((QString *)local_778._8_8_)->d).d)->_M_i + -1;
                  UNLOCK();
                  if (((__atomic_base<int> *)&(((QString *)local_778._8_8_)->d).d)->_M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_778._8_8_,2,0x10);
                  }
                }
                if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
                  }
                }
                if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0)
                {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                           super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                                super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                               super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                pQVar26 = *ppQVar1;
                pcVar25 = "TARGET_x.y.z";
                goto LAB_001d89fe;
              }
              ProKey::ProKey((ProKey *)local_3c8,"PRL_TARGET");
              pQVar20 = (QMovableArrayOps<ProString> *)
                        QMakeEvaluator::valuesRef
                                  (&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_608,"TARGET");
              QMakeEvaluator::first
                        ((ProString *)local_558,&pQVar26->super_QMakeEvaluator,(ProKey *)local_608);
              local_2d8._0_8_ = "lib";
              ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)local_558);
              ProString::ProString<char_const(&)[4],ProString>
                        ((ProString *)local_4a8,
                         (QStringBuilder<const_char_(&)[4],_ProString> *)local_2d8);
              QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                        (pQVar20,0,(ProString *)local_4a8);
              if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_2d8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._8_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
                }
              }
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_558,"TARGET_");
              pQVar16 = &QMakeEvaluator::valuesRef
                                   (&pQVar26->super_QMakeEvaluator,(ProKey *)local_558)->
                         super_QList<ProString>;
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_6f8,"TARGET");
              QMakeEvaluator::first
                        ((ProString *)&local_688,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_6f8
                        );
              local_4a8._0_8_ = "lib";
              ProString::ProString((ProString *)(local_4a8 + 8),(ProString *)&local_688);
              local_3c8._0_8_ = local_4a8._0_8_;
              ProString::ProString((ProString *)(local_3c8 + 8),(ProString *)(local_4a8 + 8));
              local_398._8_8_ = ".";
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_778,"QMAKE_EXTENSION_SHLIB");
              QMakeEvaluator::first
                        ((ProString *)&local_738,&pQVar26->super_QMakeEvaluator,(ProKey *)local_778)
              ;
              operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                         *)local_2d8,
                        (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                         *)local_3c8,(ProString *)&local_738);
              ProString::
              ProString<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>
                        ((ProString *)local_608,
                         (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_2d8);
              QList<ProString>::append(pQVar16,(ProString *)local_608);
              if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                }
              }
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_2d8);
              if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                }
              }
              if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_3c8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_3c8._8_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_4a8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_4a8._8_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo)
                              ._vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
                }
              }
              pQVar26 = *ppQVar1;
              QString::QString((QString *)local_2d8,"lib_version_first");
              config_04.m_data = (storage_type_conflict *)local_2d8._8_8_;
              config_04.m_size = local_2d8._16_8_;
              bVar12 = QMakeEvaluator::isActiveConfig
                                 (&pQVar26->super_QMakeEvaluator,config_04,false);
              if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
              pQVar26 = *ppQVar1;
              if (bVar12) {
                ProKey::ProKey((ProKey *)&local_688,"TARGET_x");
                pQVar16 = &QMakeEvaluator::valuesRef
                                     (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_688)->
                           super_QList<ProString>;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)local_778,"TARGET");
                QMakeEvaluator::first
                          ((ProString *)&local_738,&pQVar26->super_QMakeEvaluator,
                           (ProKey *)local_778);
                local_608._0_8_ = "lib";
                ProString::ProString((ProString *)(local_608 + 8),(ProString *)&local_738);
                local_558._0_8_ = local_608._0_8_;
                ProString::ProString((ProString *)(local_558 + 8),(ProString *)(local_608 + 8));
                local_528.m_string.d.ptr = L".";
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_98,"VER_MAJ");
                QMakeEvaluator::first(&local_68,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_98);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,
                          (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                           *)local_558,&local_68);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_3c8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,(char (*) [2])0x2b339e);
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)(local_128 + 0x30),"QMAKE_EXTENSION_SHLIB");
                QMakeEvaluator::first
                          (&local_c8,&pQVar26->super_QMakeEvaluator,(ProKey *)(local_128 + 0x30));
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_2d8,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                  *)local_3c8,&local_c8);
                ProString::
                ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                          ((ProString *)&local_6f8,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)local_2d8);
                QList<ProString>::append(pQVar16,(rvalue_ref)&local_6f8);
                if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo)
                                ._vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_2d8);
                if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_3c8);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_4a8);
                if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0)
                {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                           super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                                super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                               super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_558._8_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_558._8_8_,2,0x10);
                  }
                }
                if ((ProString *)local_608._8_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_608._8_8_)->d).d =
                       *(int *)&(((QString *)local_608._8_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_608._8_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_608._8_8_,2,0x10);
                  }
                }
                if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                  }
                }
                if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                  }
                }
                if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->
                                super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo
                               )._vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                  }
                }
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_738,"TARGET_x.y");
                pQVar16 = &QMakeEvaluator::valuesRef
                                     (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_738)->
                           super_QList<ProString>;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_98,"TARGET");
                QMakeEvaluator::first(&local_68,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_98);
                pPVar19 = &local_6f8.a.a.b;
                local_6f8.a.a.a = (char (*) [4])0x2b05f0;
                ProString::ProString(pPVar19,&local_68);
                local_688.a.a.a.a = local_6f8.a.a.a;
                ProString::ProString(&local_688.a.a.a.b,pPVar19);
                local_688.a.a.b = (char (*) [2])0x2b339e;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)(local_128 + 0x30),"VER_MAJ");
                QMakeEvaluator::first
                          (&local_c8,&pQVar26->super_QMakeEvaluator,(ProKey *)(local_128 + 0x30));
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_608,
                          (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                           *)&local_688,&local_c8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_558,
                          (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_608,(char (*) [2])0x2b339e);
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_158,"VER_MIN");
                QMakeEvaluator::first
                          ((ProString *)local_128,&pQVar26->super_QMakeEvaluator,
                           (ProKey *)&local_158);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_4a8,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                  *)local_558,(ProString *)local_128);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_3c8,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_4a8);
                local_320 = (char (*) [2])0x2b339e;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_1b8,"QMAKE_EXTENSION_SHLIB");
                QMakeEvaluator::first
                          (&local_188,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_1b8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_2d8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_3c8,&local_188);
                ProString::
                ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                          ((ProString *)local_778,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)local_2d8);
                QList<ProString>::append(pQVar16,(ProString *)local_778);
                if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_2d8);
                if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_1b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_1b8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_3c8);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_4a8);
                if ((UnixMakefileGenerator *)local_128._0_8_ != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                                _vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
                  }
                }
                if (&(local_158.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_158.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_558);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_608);
                if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
                  }
                }
                if (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData,2,0x10)
                    ;
                  }
                }
                if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0)
                {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                           super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                                super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                               super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                  }
                }
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_68,"TARGET_x.y.z");
                local_848 = &QMakeEvaluator::valuesRef
                                       (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_68)->
                             super_QList<ProString>;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)(local_128 + 0x30),"TARGET");
                QMakeEvaluator::first
                          (&local_c8,&pQVar26->super_QMakeEvaluator,(ProKey *)(local_128 + 0x30));
                local_778._0_8_ = "lib";
                ProString::ProString((ProString *)(local_778 + 8),&local_c8);
                local_738.a.a = (char (*) [4])local_778._0_8_;
                ProString::ProString(&local_738.a.b,(ProString *)(local_778 + 8));
                local_738.b = (char (*) [2])0x2b339e;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_158,"VER_MAJ");
                QMakeEvaluator::first
                          ((ProString *)local_128,&pQVar26->super_QMakeEvaluator,
                           (ProKey *)&local_158);
                operator+(&local_6f8,&local_738,(ProString *)local_128);
                operator+(&local_688,&local_6f8,(char (*) [2])0x2b339e);
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_1b8,"VER_MIN");
                QMakeEvaluator::first
                          (&local_188,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_1b8);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_608,&local_688,&local_188);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_558,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_608);
                local_4b0 = (char (*) [2])0x2b339e;
                pQVar26 = *ppQVar1;
                ProKey::ProKey(&local_7d8,"VER_PAT");
                QMakeEvaluator::first(&local_7a8,&pQVar26->super_QMakeEvaluator,&local_7d8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_558,&local_7a8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_3c8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,(char (*) [2])0x2b339e);
                pQVar26 = *ppQVar1;
                pcVar25 = "QMAKE_EXTENSION_SHLIB";
              }
              else {
                ProKey::ProKey((ProKey *)&local_688,"TARGET_x");
                pQVar16 = &QMakeEvaluator::valuesRef
                                     (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_688)->
                           super_QList<ProString>;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)local_778,"TARGET");
                QMakeEvaluator::first
                          ((ProString *)&local_738,&pQVar26->super_QMakeEvaluator,
                           (ProKey *)local_778);
                local_608._0_8_ = "lib";
                ProString::ProString((ProString *)(local_608 + 8),(ProString *)&local_738);
                local_558._0_8_ = local_608._0_8_;
                ProString::ProString((ProString *)(local_558 + 8),(ProString *)(local_608 + 8));
                local_528.m_string.d.ptr = L".";
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_98,"QMAKE_EXTENSION_SHLIB");
                QMakeEvaluator::first(&local_68,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_98);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,
                          (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                           *)local_558,&local_68);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_3c8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,(char (*) [2])0x2b339e);
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)(local_128 + 0x30),"VER_MAJ");
                QMakeEvaluator::first
                          (&local_c8,&pQVar26->super_QMakeEvaluator,(ProKey *)(local_128 + 0x30));
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_2d8,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                  *)local_3c8,&local_c8);
                ProString::
                ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                          ((ProString *)&local_6f8,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)local_2d8);
                QList<ProString>::append(pQVar16,(rvalue_ref)&local_6f8);
                if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo)
                                ._vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_2d8);
                if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_3c8);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_4a8);
                if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0)
                {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                           super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                                super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                               super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_558._8_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_558._8_8_,2,0x10);
                  }
                }
                if ((ProString *)local_608._8_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_608._8_8_)->d).d =
                       *(int *)&(((QString *)local_608._8_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_608._8_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_608._8_8_,2,0x10);
                  }
                }
                if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                  }
                }
                if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                  }
                }
                if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->
                                super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo
                               )._vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                  }
                }
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_738,"TARGET_x.y");
                pQVar16 = &QMakeEvaluator::valuesRef
                                     (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_738)->
                           super_QList<ProString>;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_98,"TARGET");
                QMakeEvaluator::first(&local_68,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_98);
                pPVar19 = &local_6f8.a.a.b;
                local_6f8.a.a.a = (char (*) [4])0x2b05f0;
                ProString::ProString(pPVar19,&local_68);
                local_688.a.a.a.a = local_6f8.a.a.a;
                ProString::ProString(&local_688.a.a.a.b,pPVar19);
                local_688.a.a.b = (char (*) [2])0x2b339e;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)(local_128 + 0x30),"QMAKE_EXTENSION_SHLIB");
                QMakeEvaluator::first
                          (&local_c8,&pQVar26->super_QMakeEvaluator,(ProKey *)(local_128 + 0x30));
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_608,
                          (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                           *)&local_688,&local_c8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_558,
                          (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_608,(char (*) [2])0x2b339e);
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_158,"VER_MAJ");
                QMakeEvaluator::first
                          ((ProString *)local_128,&pQVar26->super_QMakeEvaluator,
                           (ProKey *)&local_158);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_4a8,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                  *)local_558,(ProString *)local_128);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_3c8,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_4a8);
                local_320 = (char (*) [2])0x2b339e;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_1b8,"VER_MIN");
                QMakeEvaluator::first
                          (&local_188,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_1b8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_2d8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_3c8,&local_188);
                ProString::
                ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                          ((ProString *)local_778,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)local_2d8);
                QList<ProString>::append(pQVar16,(ProString *)local_778);
                if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_2d8);
                if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_1b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_1b8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_3c8);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_4a8);
                if ((UnixMakefileGenerator *)local_128._0_8_ != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                                _vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
                  }
                }
                if (&(local_158.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_158.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_558);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_608);
                if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
                  }
                }
                if (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData,2,0x10)
                    ;
                  }
                }
                if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0)
                {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                           super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                                super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                               super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                  }
                }
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_68,"TARGET_x.y.z");
                local_848 = &QMakeEvaluator::valuesRef
                                       (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_68)->
                             super_QList<ProString>;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)(local_128 + 0x30),"TARGET");
                QMakeEvaluator::first
                          (&local_c8,&pQVar26->super_QMakeEvaluator,(ProKey *)(local_128 + 0x30));
                local_778._0_8_ = "lib";
                ProString::ProString((ProString *)(local_778 + 8),&local_c8);
                local_738.a.a = (char (*) [4])local_778._0_8_;
                ProString::ProString(&local_738.a.b,(ProString *)(local_778 + 8));
                local_738.b = (char (*) [2])0x2b339e;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_158,"QMAKE_EXTENSION_SHLIB");
                QMakeEvaluator::first
                          ((ProString *)local_128,&pQVar26->super_QMakeEvaluator,
                           (ProKey *)&local_158);
                operator+(&local_6f8,&local_738,(ProString *)local_128);
                operator+(&local_688,&local_6f8,(char (*) [2])0x2b339e);
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_1b8,"VER_MAJ");
                QMakeEvaluator::first
                          (&local_188,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_1b8);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_608,&local_688,&local_188);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_558,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_608);
                local_4b0 = (char (*) [2])0x2b339e;
                pQVar26 = *ppQVar1;
                ProKey::ProKey(&local_7d8,"VER_MIN");
                QMakeEvaluator::first(&local_7a8,&pQVar26->super_QMakeEvaluator,&local_7d8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_558,&local_7a8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_3c8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,(char (*) [2])0x2b339e);
                pQVar26 = *ppQVar1;
                pcVar25 = "VER_PAT";
              }
              ProKey::ProKey(&local_838,pcVar25);
              QMakeEvaluator::first(&local_808,&pQVar26->super_QMakeEvaluator,&local_838);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
              ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                *)local_2d8,
                               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                *)local_3c8,&local_808);
              ProString::
              ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                        (&local_98,
                         (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_2d8);
              QList<ProString>::append(local_848,&local_98);
              if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_2d8);
              if (&(local_808.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_808.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_838.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)
              {
                LOCK();
                ((local_838.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((local_838.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_838.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(local_838.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_3c8);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_4a8);
              if (&(local_7a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_7a8.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_7d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)
              {
                LOCK();
                ((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(local_7d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_558);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_608);
              if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_1b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_1b8.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder(&local_688.a);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder(&local_6f8);
              if ((UnixMakefileGenerator *)local_128._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
                }
              }
              if (&(local_158.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_158.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((ProString *)local_738.a.b.m_string.d.d != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)&(local_738.a.b.m_string.d.d)->super_QArrayData)->d).d =
                     *(int *)&(((QString *)&(local_738.a.b.m_string.d.d)->super_QArrayData)->d).d +
                     -1;
                UNLOCK();
                if (*(int *)&(((QString *)&(local_738.a.b.m_string.d.d)->super_QArrayData)->d).d ==
                    0) {
                  QArrayData::deallocate(&(local_738.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((ProString *)local_778._8_8_ != (ProString *)0x0) {
                LOCK();
                ((__atomic_base<int> *)&(((QString *)local_778._8_8_)->d).d)->_M_i =
                     ((__atomic_base<int> *)&(((QString *)local_778._8_8_)->d).d)->_M_i + -1;
                UNLOCK();
                if (((__atomic_base<int> *)&(((QString *)local_778._8_8_)->d).d)->_M_i == 0) {
                  QArrayData::deallocate((QArrayData *)local_778._8_8_,2,0x10);
                }
              }
              if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                         super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                              super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                             super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              pQVar26 = *ppQVar1;
              QString::QString((QString *)local_2d8,"unversioned_libname");
              config_07.m_data = (storage_type_conflict *)local_2d8._8_8_;
              config_07.m_size = local_2d8._16_8_;
              bVar12 = QMakeEvaluator::isActiveConfig
                                 (&pQVar26->super_QMakeEvaluator,config_07,false);
              if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
              pQVar26 = *ppQVar1;
              if (bVar12) {
                pcVar25 = "TARGET_";
              }
              else {
                pcVar25 = "TARGET_x.y.z";
              }
              ProKey::ProKey((ProKey *)local_2d8,pcVar25);
            }
            else {
              ProKey::ProKey((ProKey *)local_3c8,"PRL_TARGET");
              pQVar20 = (QMovableArrayOps<ProString> *)
                        QMakeEvaluator::valuesRef
                                  (&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_608,"TARGET");
              QMakeEvaluator::first
                        ((ProString *)local_558,&pQVar26->super_QMakeEvaluator,(ProKey *)local_608);
              local_2d8._0_8_ = "lib";
              ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)local_558);
              ProString::ProString<char_const(&)[4],ProString>
                        ((ProString *)local_4a8,
                         (QStringBuilder<const_char_(&)[4],_ProString> *)local_2d8);
              QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                        (pQVar20,0,(ProString *)local_4a8);
              if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_2d8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._8_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
                }
              }
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_4a8,"TARGET_");
              pQVar16 = &QMakeEvaluator::valuesRef
                                   (&pQVar26->super_QMakeEvaluator,(ProKey *)local_4a8)->
                         super_QList<ProString>;
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_688,"TARGET");
              QMakeEvaluator::first
                        ((ProString *)local_608,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_688)
              ;
              local_3c8._0_8_ = "lib";
              ProString::ProString((ProString *)(local_3c8 + 8),(ProString *)local_608);
              local_2d8._0_8_ = local_3c8._0_8_;
              ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)(local_3c8 + 8));
              local_2a8._8_8_ = ".sl";
              ProString::ProString<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[4]>
                        ((ProString *)local_558,
                         (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[4]>
                          *)local_2d8);
              QList<ProString>::append(pQVar16,(ProString *)local_558);
              if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_2d8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._8_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_3c8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_3c8._8_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo)
                              ._vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
                }
              }
              pQVar26 = *ppQVar1;
              QString::QString((QString *)local_2d8,"lib_version_first");
              config_05.m_data = (storage_type_conflict *)local_2d8._8_8_;
              config_05.m_size = local_2d8._16_8_;
              bVar12 = QMakeEvaluator::isActiveConfig
                                 (&pQVar26->super_QMakeEvaluator,config_05,false);
              if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
              pQVar26 = *ppQVar1;
              if (bVar12) {
                ProKey::ProKey((ProKey *)local_558,"TARGET_x");
                pQVar16 = &QMakeEvaluator::valuesRef
                                     (&pQVar26->super_QMakeEvaluator,(ProKey *)local_558)->
                           super_QList<ProString>;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_6f8,"VER_MAJ");
                QMakeEvaluator::first
                          ((ProString *)&local_688,&pQVar26->super_QMakeEvaluator,
                           (ProKey *)&local_6f8);
                local_4a8._0_8_ = "lib";
                ProString::ProString((ProString *)(local_4a8 + 8),(ProString *)&local_688);
                local_3c8._0_8_ = local_4a8._0_8_;
                ProString::ProString((ProString *)(local_3c8 + 8),(ProString *)(local_4a8 + 8));
                pQVar26 = *ppQVar1;
                pcVar25 = "TARGET";
              }
              else {
                ProKey::ProKey((ProKey *)local_558,"TARGET_x");
                pQVar16 = &QMakeEvaluator::valuesRef
                                     (&pQVar26->super_QMakeEvaluator,(ProKey *)local_558)->
                           super_QList<ProString>;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_6f8,"TARGET");
                QMakeEvaluator::first
                          ((ProString *)&local_688,&pQVar26->super_QMakeEvaluator,
                           (ProKey *)&local_6f8);
                local_4a8._0_8_ = "lib";
                ProString::ProString((ProString *)(local_4a8 + 8),(ProString *)&local_688);
                local_3c8._0_8_ = local_4a8._0_8_;
                ProString::ProString((ProString *)(local_3c8 + 8),(ProString *)(local_4a8 + 8));
                pQVar26 = *ppQVar1;
                pcVar25 = "VER_MAJ";
              }
              local_398._8_8_ = ".";
              ProKey::ProKey((ProKey *)local_778,pcVar25);
              QMakeEvaluator::first
                        ((ProString *)&local_738,&pQVar26->super_QMakeEvaluator,(ProKey *)local_778)
              ;
              operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                         *)local_2d8,
                        (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                         *)local_3c8,(ProString *)&local_738);
              ProString::
              ProString<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>
                        ((ProString *)local_608,
                         (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_2d8);
              QList<ProString>::append(pQVar16,(ProString *)local_608);
              if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                }
              }
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_2d8);
              if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                }
              }
              if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_3c8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_3c8._8_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_4a8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_4a8._8_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo)
                              ._vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
                }
              }
              pQVar26 = *ppQVar1;
              pcVar25 = "TARGET_x";
LAB_001d89fe:
              ProKey::ProKey((ProKey *)local_2d8,pcVar25);
            }
            pQVar21 = (QArrayDataPointer<ProString> *)
                      QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
            pQVar26 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_3c8,"TARGET");
            pQVar22 = (QArrayDataPointer<ProString> *)
                      QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
            QArrayDataPointer<ProString>::operator=(pQVar22,pQVar21);
            if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              ((__atomic_base<int> *)
              &(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo)->_M_i =
                   ((__atomic_base<int> *)
                   &(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo)->_M_i + -1;
              iVar2 = ((__atomic_base<int> *)
                      &(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo)->_M_i;
              UNLOCK();
              pUVar27 = (UnixMakefileGenerator *)local_2d8._0_8_;
              goto joined_r0x001d59e9;
            }
          }
        }
        else {
          ProKey::ProKey((ProKey *)local_608,"PRL_TARGET");
          pQVar20 = (QMovableArrayOps<ProString> *)
                    QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_608);
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_738,"QMAKE_BUNDLE");
          QMakeEvaluator::first
                    ((ProString *)&local_6f8,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_738);
          ProString::ProString((ProString *)local_558,(ProString *)&local_6f8);
          local_528.m_string.d.d = (Data *)0x2aa5bc;
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_68,"QMAKE_FRAMEWORK_VERSION");
          QMakeEvaluator::first
                    ((ProString *)local_778,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_68);
          ProString::ProString((ProString *)local_4a8,(ProString *)local_558);
          local_4a8._48_8_ = local_528.m_string.d.d;
          ProString::ProString((ProString *)(local_4a8 + 0x38),(ProString *)local_778);
          ProString::ProString((ProString *)local_3c8,(ProString *)local_4a8);
          local_398._0_8_ = local_4a8._48_8_;
          ProString::ProString((ProString *)(local_398 + 8),(ProString *)(local_4a8 + 0x38));
          local_360 = (ProString *)0x2ab352;
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_c8,"TARGET");
          QMakeEvaluator::first(&local_98,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_c8);
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
          ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
                            *)local_2d8,
                           (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>
                            *)local_3c8,&local_98);
          ProString::
          ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,char_const(&)[11]>,ProString>,char_const(&)[12]>,ProString>
                    ((ProString *)&local_688,
                     (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
                      *)local_2d8);
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    (pQVar20,0,(ProString *)&local_688);
          if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
            }
          }
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
                             *)local_2d8);
          if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                     local_3c8);
          QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                     local_4a8);
          if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                     super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                          super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                         super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
            }
          }
          if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
            }
          }
          local_608._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_5e0 = &DAT_aaaaaaaaaaaaaaaa;
          local_608._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_608._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_608._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_608._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)local_2d8,"QMAKE_BUNDLE_LOCATION");
          QMakeEvaluator::first
                    ((ProString *)local_608,&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
          if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
            }
          }
          if ((local_608._28_4_ != 0) &&
             (bVar12 = ProString::startsWith((ProString *)local_608,"/",CaseSensitive), !bVar12)) {
            ProString::ProString((ProString *)local_2d8,"/");
            ProString::prepend((ProString *)local_608,(ProString *)local_2d8);
            if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
          }
          bVar12 = ProString::endsWith((ProString *)local_608,"/",CaseSensitive);
          if (!bVar12) {
            other_00.m_data = "/";
            other_00.m_size = 1;
            ProString::append((ProString *)local_608,other_00);
          }
          local_128._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_128._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)local_558,"QMAKE_BUNDLE");
          QMakeEvaluator::first
                    ((ProString *)local_4a8,&pQVar26->super_QMakeEvaluator,(ProKey *)local_558);
          ProString::ProString((ProString *)local_3c8,(ProString *)local_4a8);
          pQVar26 = *ppQVar1;
          local_398._0_8_ = (ProString *)local_608;
          ProKey::ProKey((ProKey *)&local_6f8,"TARGET");
          QMakeEvaluator::first
                    ((ProString *)&local_688,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_6f8);
          ProString::ProString((ProString *)local_2d8,(ProString *)local_3c8);
          local_2a8._0_8_ = local_398._0_8_;
          ProString::ProString((ProString *)(local_2a8 + 8),(ProString *)&local_688);
          QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString>::convertTo<QString>
                    ((QString *)local_128,
                     (QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString> *)local_2d8)
          ;
          QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString> *)local_2d8)
          ;
          if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
            }
          }
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)local_2d8,"TARGET_");
          pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8)->
                     super_QList<ProString>;
          ProString::ProString((ProString *)local_3c8,(QString *)local_128);
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_3c8
                    );
          QList<ProString>::end(pQVar16);
          if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
            }
          }
          pQVar26 = *ppQVar1;
          QVar34.m_data = (storage_type *)0xe;
          QVar34.m_size = (qsizetype)local_2d8;
          QString::fromUtf8(QVar34);
          uVar4 = local_2d8._0_8_;
          config_03.m_data = (storage_type_conflict *)local_2d8._8_8_;
          config_03.m_size = local_2d8._16_8_;
          bVar12 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config_03,false);
          if ((UnixMakefileGenerator *)uVar4 != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
            }
          }
          pQVar26 = *ppQVar1;
          if (bVar12) {
            ProKey::ProKey((ProKey *)local_2d8,"TARGET_x.y");
            pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8)
                       ->super_QList<ProString>;
            ProString::ProString((ProString *)local_3c8,(QString *)local_128);
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                      ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,
                       (ProString *)local_3c8);
            QList<ProString>::end(pQVar16);
            if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              ((__atomic_base<int> *)
              &(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo)->_M_i =
                   ((__atomic_base<int> *)
                   &(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo)->_M_i + -1;
              iVar2 = ((__atomic_base<int> *)
                      &(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo)->_M_i;
              UNLOCK();
              pUVar27 = (UnixMakefileGenerator *)local_2d8._0_8_;
joined_r0x001d5993:
              if (iVar2 == 0) {
                QArrayData::deallocate((QArrayData *)pUVar27,2,0x10);
              }
            }
          }
          else {
            ProKey::ProKey((ProKey *)&local_688,"TARGET_x.y");
            pQVar16 = &QMakeEvaluator::valuesRef
                                 (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_688)->
                       super_QList<ProString>;
            pQVar26 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_778,"QMAKE_BUNDLE");
            QMakeEvaluator::first
                      ((ProString *)&local_738,&pQVar26->super_QMakeEvaluator,(ProKey *)local_778);
            ProString::ProString((ProString *)local_558,(ProString *)&local_738);
            local_528.m_string.d.d = (Data *)0x2aa5bc;
            pQVar26 = *ppQVar1;
            ProKey::ProKey((ProKey *)&local_98,"QMAKE_FRAMEWORK_VERSION");
            QMakeEvaluator::first(&local_68,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_98);
            ProString::ProString((ProString *)local_4a8,(ProString *)local_558);
            local_4a8._48_8_ = local_528.m_string.d.d;
            ProString::ProString((ProString *)(local_4a8 + 0x38),&local_68);
            ProString::ProString((ProString *)local_3c8,(ProString *)local_4a8);
            local_398._0_8_ = local_4a8._48_8_;
            ProString::ProString((ProString *)(local_398 + 8),(ProString *)(local_4a8 + 0x38));
            local_360 = (ProString *)local_608;
            pQVar26 = *ppQVar1;
            ProKey::ProKey((ProKey *)(local_128 + 0x30),"TARGET");
            QMakeEvaluator::first
                      (&local_c8,&pQVar26->super_QMakeEvaluator,(ProKey *)(local_128 + 0x30));
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
            ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
                              *)local_2d8,
                             (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>
                              *)local_3c8,&local_c8);
            ProString::
            ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,char_const(&)[11]>,ProString>,ProString&>,ProString>
                      ((ProString *)&local_6f8,
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
                        *)local_2d8);
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                      ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,
                       (ProString *)&local_6f8);
            QList<ProString>::end(pQVar16);
            if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
              }
            }
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
                               *)local_2d8);
            if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
              }
            }
            QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::
            ~QStringBuilder((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>
                             *)local_3c8);
            QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::
            ~QStringBuilder((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>
                             *)local_4a8);
            if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                       super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                            super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                           super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
              }
            }
            if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
              }
            }
            if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
              LOCK();
              ((__atomic_base<int> *)
              &(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo)->_M_i =
                   ((__atomic_base<int> *)
                   &(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo)->_M_i + -1;
              iVar2 = ((__atomic_base<int> *)
                      &(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo)->_M_i;
              UNLOCK();
              pUVar27 = (UnixMakefileGenerator *)local_688.a.a.a.a;
              goto joined_r0x001d5993;
            }
          }
          if ((UnixMakefileGenerator *)local_128._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_608._0_8_ == (UnixMakefileGenerator *)0x0)
          goto LAB_001d8aba;
          LOCK();
          ((__atomic_base<int> *)
          &(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
           _vptr_QMakeSourceFileInfo)->_M_i =
               ((__atomic_base<int> *)
               &(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                _vptr_QMakeSourceFileInfo)->_M_i + -1;
          iVar2 = ((__atomic_base<int> *)
                  &(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo)->_M_i;
          UNLOCK();
          pUVar27 = (UnixMakefileGenerator *)local_608._0_8_;
joined_r0x001d59e9:
          if (iVar2 == 0) {
            QArrayData::deallocate((QArrayData *)pUVar27,2,0x10);
          }
        }
LAB_001d8aba:
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"QMAKE_LFLAGS_SONAME");
        pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
        lVar3 = (pPVar17->super_QList<ProString>).d.size;
        if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        if (lVar3 != 0) {
          local_558._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_530 = &DAT_aaaaaaaaaaaaaaaa;
          local_558._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_558._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_558._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_558._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          ProString::ProString((ProString *)local_558);
          pQVar26 = *ppQVar1;
          QVar35.m_data = (storage_type *)0x6;
          QVar35.m_size = (qsizetype)local_2d8;
          QString::fromUtf8(QVar35);
          uVar4 = local_2d8._0_8_;
          config_08.m_data = (storage_type_conflict *)local_2d8._8_8_;
          config_08.m_size = local_2d8._16_8_;
          bVar12 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config_08,false);
          if ((UnixMakefileGenerator *)uVar4 != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
            }
          }
          pQVar26 = *ppQVar1;
          if (bVar12) {
            ProKey::ProKey((ProKey *)local_2d8,"TARGET");
            pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
            lVar3 = (pPVar17->super_QList<ProString>).d.size;
            if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            if (lVar3 == 0) goto LAB_001d8f5e;
            pQVar26 = *ppQVar1;
            pcVar25 = "TARGET";
LAB_001d8ed8:
            ProKey::ProKey((ProKey *)local_3c8,pcVar25);
            QMakeEvaluator::first
                      ((ProString *)local_2d8,&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
            ProString::append((ProString *)local_558,(ProString *)local_2d8,(bool *)0x0);
            if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              ((__atomic_base<int> *)
              &(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo)->_M_i =
                   ((__atomic_base<int> *)
                   &(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo)->_M_i + -1;
              UNLOCK();
              pUVar27 = (UnixMakefileGenerator *)local_3c8._0_8_;
              if (((__atomic_base<int> *)
                  &(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo)->_M_i == 0) {
LAB_001d8f4f:
                QArrayData::deallocate((QArrayData *)pUVar27,2,0x10);
              }
            }
          }
          else {
            ProKey::ProKey((ProKey *)local_2d8,"QMAKE_BUNDLE");
            bVar12 = QMakeProject::isEmpty(pQVar26,(ProKey *)local_2d8);
            if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            if (!bVar12) {
              pQVar26 = *ppQVar1;
              pcVar25 = "TARGET_x.y";
              goto LAB_001d8ed8;
            }
            pQVar26 = *ppQVar1;
            QString::QString((QString *)local_2d8,"unversioned_soname");
            config_09.m_data = (storage_type_conflict *)local_2d8._8_8_;
            config_09.m_size = local_2d8._16_8_;
            bVar12 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config_09,false);
            if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            if (bVar12) {
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_688,"QMAKE_ORIG_TARGET");
              QMakeEvaluator::first
                        ((ProString *)local_608,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_688)
              ;
              local_4a8._0_8_ = "lib";
              ProString::ProString((ProString *)(local_4a8 + 8),(ProString *)local_608);
              local_3c8._0_8_ = local_4a8._0_8_;
              ProString::ProString((ProString *)(local_3c8 + 8),(ProString *)(local_4a8 + 8));
              local_398._8_8_ = ".";
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_738,"QMAKE_EXTENSION_SHLIB");
              QMakeEvaluator::first
                        ((ProString *)&local_6f8,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_738
                        );
              operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                         *)local_2d8,
                        (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                         *)local_3c8,(ProString *)&local_6f8);
              ProString::operator=
                        ((ProString *)local_558,
                         (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_2d8);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_2d8);
              if ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                }
              }
              if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                }
              }
              if ((QArrayData *)local_3c8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_3c8._8_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_4a8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_4a8._8_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_688.a.a.a.a == (UnixMakefileGenerator *)0x0)
              goto LAB_001d8f5e;
              LOCK();
              ((__atomic_base<int> *)
              &(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo)->_M_i =
                   ((__atomic_base<int> *)
                   &(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo)->_M_i + -1;
              UNLOCK();
              pUVar27 = (UnixMakefileGenerator *)local_688.a.a.a.a;
              if (((__atomic_base<int> *)
                  &(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo)->_M_i != 0) goto LAB_001d8f5e;
              goto LAB_001d8f4f;
            }
            pQVar26 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_2d8,"TARGET_x");
            pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
            lVar3 = (pPVar17->super_QList<ProString>).d.size;
            if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            if (lVar3 != 0) {
              pQVar26 = *ppQVar1;
              pcVar25 = "TARGET_x";
              goto LAB_001d8ed8;
            }
          }
LAB_001d8f5e:
          if (local_558._28_4_ != 0) {
            pQVar26 = *ppQVar1;
            QVar36.m_data = (storage_type *)0x17;
            QVar36.m_size = (qsizetype)local_2d8;
            QString::fromUtf8(QVar36);
            uVar4 = local_2d8._0_8_;
            bVar12 = false;
            config_10.m_data = (storage_type_conflict *)local_2d8._8_8_;
            config_10.m_size = local_2d8._16_8_;
            bVar13 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config_10,false);
            bVar15 = false;
            if (bVar13) {
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_688,"INSTALLS");
              pQVar16 = &QMakeEvaluator::valuesRef
                                   (&pQVar26->super_QMakeEvaluator,(ProKey *)&local_688)->
                         super_QList<ProString>;
              bVar12 = false;
              qVar23 = QtPrivate::indexOf<ProString,char[7]>(pQVar16,(char (*) [7])0x2a899e,0);
              if (qVar23 == -1) {
                bVar15 = false;
              }
              else {
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_6f8,"target.path");
                bVar15 = QMakeProject::isEmpty(pQVar26,(ProKey *)&local_6f8);
                bVar15 = !bVar15;
                bVar12 = true;
              }
            }
            if ((bVar12) &&
               ((UnixMakefileGenerator *)local_6f8.a.a.a != (UnixMakefileGenerator *)0x0)) {
              LOCK();
              *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)*local_6f8.a.a.a)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
              }
            }
            if ((bVar13) &&
               ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0)) {
              LOCK();
              *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)uVar4 != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
              }
            }
            if (bVar15) {
              local_4a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_4a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_4a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_3c8,"target.path");
              QMakeEvaluator::first
                        ((ProString *)local_2d8,&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
              ProString::toQString((QString *)local_608,(ProString *)local_2d8);
              Option::fixPathToTargetOS((QString *)local_4a8,(QString *)local_608,true,true);
              if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                ((__atomic_base<int> *)
                &(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo)->_M_i =
                     ((__atomic_base<int> *)
                     &(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo)->_M_i + -1;
                iVar2 = ((__atomic_base<int> *)
                        &(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo)->_M_i;
                UNLOCK();
                pUVar27 = (UnixMakefileGenerator *)local_3c8._0_8_;
joined_r0x001d9319:
                if (iVar2 == 0) {
                  QArrayData::deallocate((QArrayData *)pUVar27,2,0x10);
                }
              }
LAB_001d9328:
              cVar14 = QString::endsWith((QString *)local_4a8,0x2e2bf0);
              if (cVar14 == '\0') {
                QString::append((QString *)local_4a8);
              }
              ProString::ProString((ProString *)local_2d8,(QString *)local_4a8);
              ProString::prepend((ProString *)local_558,(ProString *)local_2d8);
              if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
              if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
                }
              }
            }
            else {
              pQVar26 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_2d8,"QMAKE_SONAME_PREFIX");
              bVar12 = QMakeProject::isEmpty(pQVar26,(ProKey *)local_2d8);
              if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
                LOCK();
                *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo =
                     *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                              _vptr_QMakeSourceFileInfo + -1;
                UNLOCK();
                if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                             _vptr_QMakeSourceFileInfo == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
              if (!bVar12) {
                local_4a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_4a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_4a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                pQVar26 = *ppQVar1;
                ProKey::ProKey((ProKey *)local_3c8,"QMAKE_SONAME_PREFIX");
                QMakeEvaluator::first
                          ((ProString *)local_2d8,&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8
                          );
                ProString::toQString((QString *)local_4a8,(ProString *)local_2d8);
                if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                                _vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                  }
                }
                if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
                  LOCK();
                  *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo =
                       *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                                _vptr_QMakeSourceFileInfo + -1;
                  UNLOCK();
                  if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                               _vptr_QMakeSourceFileInfo == 0) {
                    QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
                  }
                }
                cVar14 = QString::startsWith((QChar)(char16_t)local_4a8,0x40);
                if (cVar14 == '\0') {
                  Option::fixPathToTargetOS((QString *)local_2d8,(QString *)local_4a8,false,true);
                  uVar11 = local_2d8._16_8_;
                  uVar10 = local_2d8._8_8_;
                  uVar9 = local_2d8._0_8_;
                  uVar5 = local_4a8._16_8_;
                  uVar4 = local_4a8._8_8_;
                  pUVar27 = (UnixMakefileGenerator *)local_4a8._0_8_;
                  local_4a8._0_8_ = local_2d8._0_8_;
                  local_4a8._8_8_ = local_2d8._8_8_;
                  local_2d8._0_8_ = pUVar27;
                  local_2d8._8_8_ = uVar4;
                  local_4a8._16_8_ = local_2d8._16_8_;
                  local_2d8._16_8_ = uVar5;
                  if (pUVar27 != (UnixMakefileGenerator *)0x0) {
                    LOCK();
                    ((__atomic_base<int> *)
                    &(pUVar27->super_MakefileGenerator).super_QMakeSourceFileInfo.
                     _vptr_QMakeSourceFileInfo)->_M_i =
                         ((__atomic_base<int> *)
                         &(pUVar27->super_MakefileGenerator).super_QMakeSourceFileInfo.
                          _vptr_QMakeSourceFileInfo)->_M_i + -1;
                    iVar2 = ((__atomic_base<int> *)
                            &(pUVar27->super_MakefileGenerator).super_QMakeSourceFileInfo.
                             _vptr_QMakeSourceFileInfo)->_M_i;
                    UNLOCK();
                    local_4a8._16_8_ = uVar11;
                    local_4a8._0_8_ = uVar9;
                    local_4a8._8_8_ = uVar10;
                    goto joined_r0x001d9319;
                  }
                }
                goto LAB_001d9328;
              }
            }
            MakefileGenerator::escapeFilePath
                      ((ProString *)local_2d8,&this->super_MakefileGenerator,(ProString *)local_558)
            ;
            pQVar26 = (this->super_MakefileGenerator).project;
            ProKey::ProKey((ProKey *)local_3c8,"QMAKE_LFLAGS_SONAME");
            pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8)
                       ->super_QList<ProString>;
            iVar18 = QList<ProString>::begin(pQVar16);
            ProString::append(iVar18.i,(ProString *)local_2d8,(bool *)0x0);
            if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
              }
            }
            if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
              LOCK();
              *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo =
                   *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                            _vptr_QMakeSourceFileInfo + -1;
              UNLOCK();
              if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                           _vptr_QMakeSourceFileInfo == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
          }
          if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
            }
          }
        }
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"QMAKE_LINK_SHLIB_CMD");
        pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
        lVar3 = (pPVar17->super_QList<ProString>).d.size;
        if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        if (lVar3 == 0) {
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)local_4a8,"QMAKE_LINK_SHLIB_CMD");
          pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_4a8)->
                     super_QList<ProString>;
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_738,"QMAKE_LINK_O_FLAG");
          QMakeEvaluator::first
                    ((ProString *)local_608,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_738);
          local_3c8._0_8_ = "$(LINK) $(LFLAGS) ";
          ProString::ProString((ProString *)(local_3c8 + 8),(ProString *)local_608);
          local_2d8._0_8_ = local_3c8._0_8_;
          ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)(local_3c8 + 8));
          local_2a8._8_8_ = "$(TARGET) $(OBJECTS) $(LIBS) $(OBJCOMP)";
          ProString::ProString<QStringBuilder<char_const(&)[19],ProString>,char_const(&)[40]>
                    ((ProString *)local_558,
                     (QStringBuilder<QStringBuilder<const_char_(&)[19],_ProString>,_const_char_(&)[40]>
                      *)local_2d8);
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_558
                    );
          QList<ProString>::end(pQVar16);
          if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_2d8._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_2d8._8_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_3c8._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_3c8._8_8_,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            ((__atomic_base<int> *)
            &(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
             _vptr_QMakeSourceFileInfo)->_M_i =
                 ((__atomic_base<int> *)
                 &(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                  _vptr_QMakeSourceFileInfo)->_M_i + -1;
            iVar2 = ((__atomic_base<int> *)
                    &(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo)->_M_i;
            UNLOCK();
            pUVar27 = (UnixMakefileGenerator *)local_4a8._0_8_;
            goto joined_r0x001da32f;
          }
        }
      }
    }
    else {
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_BUNDLE");
      bVar12 = QMakeProject::isEmpty(pQVar26,(ProKey *)local_2d8);
      if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      if (!bVar12) {
        local_3c8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_3a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_3c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_3c8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_3c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_3c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"QMAKE_BUNDLE_LOCATION");
        QMakeEvaluator::first
                  ((ProString *)local_3c8,&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
        if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        if ((local_3c8._28_4_ != 0) &&
           (bVar12 = ProString::startsWith((ProString *)local_3c8,"/",CaseSensitive), !bVar12)) {
          ProString::ProString((ProString *)local_2d8,"/");
          ProString::prepend((ProString *)local_3c8,(ProString *)local_2d8);
          if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
            }
          }
        }
        bVar12 = ProString::endsWith((ProString *)local_3c8,"/",CaseSensitive);
        if (!bVar12) {
          other.m_data = "/";
          other.m_size = 1;
          ProString::append((ProString *)local_3c8,other);
        }
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_4a8,"TARGET");
        pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_4a8)->
                   super_QList<ProString>;
        iVar18 = QList<ProString>::begin(pQVar16);
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_688,"QMAKE_BUNDLE");
        QMakeEvaluator::first
                  ((ProString *)local_608,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_688);
        ProString::ProString((ProString *)local_2d8,(ProString *)local_608);
        local_2a8._0_8_ = (ProString *)local_3c8;
        ProString::ProString<ProString,ProString&>
                  ((ProString *)local_558,(QStringBuilder<ProString,_ProString_&> *)local_2d8);
        ProString::prepend(iVar18.i,(ProString *)local_558);
        if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_688.a.a.a.a != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)*local_688.a.a.a.a)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
          }
        }
      }
      pQVar26 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_2d8,"TARGET");
      bVar12 = QMakeProject::isEmpty(pQVar26,(ProKey *)local_2d8);
      if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      if (!bVar12) {
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"TARGET");
        pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8)->
                   super_QList<ProString>;
        iVar18 = QList<ProString>::begin(pQVar16);
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_4a8,"DESTDIR");
        QMakeEvaluator::first
                  ((ProString *)local_3c8,&pQVar26->super_QMakeEvaluator,(ProKey *)local_4a8);
        ProString::prepend(iVar18.i,(ProString *)local_3c8);
        if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
          }
        }
joined_r0x001d35bc:
        if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          ((__atomic_base<int> *)
          &(((UnixMakefileGenerator *)local_2d8._0_8_)->super_MakefileGenerator).
           super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo)->_M_i =
               ((__atomic_base<int> *)
               &(((UnixMakefileGenerator *)local_2d8._0_8_)->super_MakefileGenerator).
                super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo)->_M_i + -1;
          iVar2 = ((__atomic_base<int> *)
                  &(((UnixMakefileGenerator *)local_2d8._0_8_)->super_MakefileGenerator).
                   super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo)->_M_i;
          UNLOCK();
          pUVar27 = (UnixMakefileGenerator *)local_2d8._0_8_;
          goto joined_r0x001da32f;
        }
      }
    }
  }
LAB_001d94f5:
  pQVar26 = *ppQVar1;
  ProKey::ProKey((ProKey *)local_2d8,"QMAKE_APP_FLAG");
  pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
  bVar12 = true;
  if ((pPVar17->super_QList<ProString>).d.size == 0) {
    pQVar26 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_778,"TEMPLATE");
    QMakeEvaluator::first
              ((ProString *)&local_738,&pQVar26->super_QMakeEvaluator,(ProKey *)local_778);
    bVar12 = ProString::operator==((ProString *)&local_738,"aux");
    if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
      }
    }
    if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
      }
    }
  }
  if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
    LOCK();
    *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
             _vptr_QMakeSourceFileInfo =
         *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                  _vptr_QMakeSourceFileInfo + -1;
    UNLOCK();
    if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo == 0) {
      QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
    }
  }
  pQVar26 = *ppQVar1;
  if (bVar12 == false) {
    QVar37.m_data = (storage_type *)0x3;
    QVar37.m_size = (qsizetype)local_2d8;
    QString::fromUtf8(QVar37);
    uVar4 = local_2d8._0_8_;
    config_11.m_data = (storage_type_conflict *)local_2d8._8_8_;
    config_11.m_size = local_2d8._16_8_;
    bVar12 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config_11,false);
    if ((UnixMakefileGenerator *)uVar4 != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
      }
    }
    if (!bVar12) goto LAB_001daa4d;
    pQVar26 = *ppQVar1;
    pUVar27 = (UnixMakefileGenerator *)local_2d8;
    QVar38.m_data = (storage_type *)0x6;
    QVar38.m_size = (qsizetype)pUVar27;
    QString::fromUtf8(QVar38);
    uVar4 = local_2d8._0_8_;
    config_12.m_data = (storage_type_conflict *)local_2d8._8_8_;
    config_12.m_size = local_2d8._16_8_;
    bVar12 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config_12,false);
    if (bVar12) {
      pQVar26 = *ppQVar1;
      QVar39.m_data = (storage_type *)0x1c;
      QVar39.m_size = (qsizetype)local_2d8;
      QString::fromUtf8(QVar39);
      pUVar27 = (UnixMakefileGenerator *)local_2d8._0_8_;
      config_13.m_data = (storage_type_conflict *)local_2d8._8_8_;
      config_13.m_size = local_2d8._16_8_;
      bVar15 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config_13,false);
      bVar15 = !bVar15;
    }
    else {
      bVar15 = true;
    }
    if (bVar12 && pUVar27 != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(pUVar27->super_MakefileGenerator).super_QMakeSourceFileInfo.
               _vptr_QMakeSourceFileInfo =
           *(int *)&(pUVar27->super_MakefileGenerator).super_QMakeSourceFileInfo.
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(pUVar27->super_MakefileGenerator).super_QMakeSourceFileInfo.
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)pUVar27,2,0x10);
      }
    }
    if ((UnixMakefileGenerator *)uVar4 != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
      }
    }
    if (bVar15) {
      pQVar26 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_CFLAGS_SHLIB");
      pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
      pQVar26 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CFLAGS");
      pPVar24 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPVar19 = (pPVar17->super_QList<ProString>).d.ptr;
      QtPrivate::QCommonArrayOps<ProString>::growAppend
                ((QCommonArrayOps<ProString> *)pPVar24,pPVar19,
                 pPVar19 + (pPVar17->super_QList<ProString>).d.size);
      if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      pQVar26 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_CXXFLAGS_SHLIB");
      pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
      pQVar26 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CXXFLAGS");
      pPVar24 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPVar19 = (pPVar17->super_QList<ProString>).d.ptr;
      QtPrivate::QCommonArrayOps<ProString>::growAppend
                ((QCommonArrayOps<ProString> *)pPVar24,pPVar19,
                 pPVar19 + (pPVar17->super_QList<ProString>).d.size);
      if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
    }
    pQVar26 = *ppQVar1;
    QVar40.m_data = (storage_type *)0x6;
    QVar40.m_size = (qsizetype)local_2d8;
    QString::fromUtf8(QVar40);
    uVar4 = local_2d8._0_8_;
    config_14.m_data = (storage_type_conflict *)local_2d8._8_8_;
    config_14.m_size = local_2d8._16_8_;
    bVar12 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config_14,false);
    if ((UnixMakefileGenerator *)uVar4 != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
      }
    }
    pQVar26 = *ppQVar1;
    if (bVar12) {
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_CFLAGS_PLUGIN");
      pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
      pQVar26 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CFLAGS");
      pPVar24 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPVar19 = (pPVar17->super_QList<ProString>).d.ptr;
      QtPrivate::QCommonArrayOps<ProString>::growAppend
                ((QCommonArrayOps<ProString> *)pPVar24,pPVar19,
                 pPVar19 + (pPVar17->super_QList<ProString>).d.size);
      if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      pQVar26 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_CXXFLAGS_PLUGIN");
      pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
      pQVar26 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CXXFLAGS");
      pPVar24 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPVar19 = (pPVar17->super_QList<ProString>).d.ptr;
      QtPrivate::QCommonArrayOps<ProString>::growAppend
                ((QCommonArrayOps<ProString> *)pPVar24,pPVar19,
                 pPVar19 + (pPVar17->super_QList<ProString>).d.size);
      if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      pQVar26 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_LFLAGS_PLUGIN");
      pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
      pQVar26 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_LFLAGS");
      pPVar24 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPVar19 = (pPVar17->super_QList<ProString>).d.ptr;
      QtPrivate::QCommonArrayOps<ProString>::growAppend
                ((QCommonArrayOps<ProString> *)pPVar24,pPVar19,
                 pPVar19 + (pPVar17->super_QList<ProString>).d.size);
      if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      pQVar26 = *ppQVar1;
      QVar41.m_data = (storage_type *)0x12;
      QVar41.m_size = (qsizetype)local_2d8;
      QString::fromUtf8(QVar41);
      uVar4 = local_2d8._0_8_;
      config_15.m_data = (storage_type_conflict *)local_2d8._8_8_;
      config_15.m_size = local_2d8._16_8_;
      bVar12 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config_15,false);
      if ((UnixMakefileGenerator *)uVar4 != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo
             = *(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)uVar4)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
        }
      }
      if (!bVar12) goto LAB_001daa4d;
    }
    else {
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_LFLAGS_SHLIB");
      pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
      pQVar26 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_LFLAGS");
      pPVar24 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPVar19 = (pPVar17->super_QList<ProString>).d.ptr;
      QtPrivate::QCommonArrayOps<ProString>::growAppend
                ((QCommonArrayOps<ProString> *)pPVar24,pPVar19,
                 pPVar19 + (pPVar17->super_QList<ProString>).d.size);
      if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      pQVar26 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_LFLAGS_COMPAT_VERSION");
      bVar12 = QMakeProject::isEmpty(pQVar26,(ProKey *)local_2d8);
      if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      if (!bVar12) {
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"COMPAT_VERSION");
        bVar12 = QMakeProject::isEmpty(pQVar26,(ProKey *)local_2d8);
        if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        if (bVar12) {
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_68,"QMAKE_LFLAGS_COMPAT_VERSION");
          QMakeEvaluator::first
                    ((ProString *)local_608,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_68);
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_c8,"VER_MAJ");
          QMakeEvaluator::first(&local_98,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_c8);
          ProString::ProString((ProString *)local_4a8,(ProString *)local_608);
          ProString::ProString((ProString *)(local_4a8 + 0x30),&local_98);
          ProString::ProString((ProString *)local_3c8,(ProString *)local_4a8);
          ProString::ProString((ProString *)local_398,(ProString *)(local_4a8 + 0x30));
          local_368 = (Data *)0x2b339e;
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)local_128,"VER_MIN");
          QMakeEvaluator::first
                    ((ProString *)(local_128 + 0x30),&pQVar26->super_QMakeEvaluator,
                     (ProKey *)local_128);
          QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
          ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)local_2d8,
                           (QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>
                            *)local_3c8,(ProString *)(local_128 + 0x30));
          QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
          ::convertTo<QString>
                    (&local_188.m_string,
                     (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                      *)local_2d8);
          ProString::ProString((ProString *)local_558,&local_188.m_string);
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_158,"QMAKE_LFLAGS");
          pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)&local_158)
                     ->super_QList<ProString>;
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_558
                    );
          QList<ProString>::end(pQVar16);
          if (&(local_158.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_158.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
            }
          }
          if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_2d8);
          if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_128._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
            }
          }
          QStringBuilder<ProString,_ProString>::~QStringBuilder
                    ((QStringBuilder<ProString,_ProString> *)local_3c8);
          QStringBuilder<ProString,_ProString>::~QStringBuilder
                    ((QStringBuilder<ProString,_ProString> *)local_4a8);
          if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0) {
            LOCK();
            ((__atomic_base<int> *)
            &(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
             super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo)->_M_i =
                 ((__atomic_base<int> *)
                 &(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                  super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo)->_M_i + -1;
            iVar2 = ((__atomic_base<int> *)
                    &(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                     super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo)->_M_i;
            UNLOCK();
            pUVar27 = (UnixMakefileGenerator *)local_68.m_string.d.d;
joined_r0x001da541:
            if (iVar2 == 0) {
              QArrayData::deallocate((QArrayData *)pUVar27,2,0x10);
            }
          }
        }
        else {
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)local_558,"QMAKE_LFLAGS_COMPAT_VERSION");
          QMakeEvaluator::first
                    ((ProString *)local_4a8,&pQVar26->super_QMakeEvaluator,(ProKey *)local_558);
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_68,"COMPATIBILITY_VERSION");
          QMakeEvaluator::first
                    ((ProString *)local_608,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_68);
          ProString::ProString((ProString *)local_2d8,(ProString *)local_4a8);
          ProString::ProString((ProString *)local_2a8,(ProString *)local_608);
          QStringBuilder<ProString,_ProString>::convertTo<QString>
                    (&local_c8.m_string,(QStringBuilder<ProString,_ProString> *)local_2d8);
          ProString::ProString((ProString *)local_3c8,&local_c8.m_string);
          pQVar26 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_98,"QMAKE_LFLAGS");
          pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)&local_98)->
                     super_QList<ProString>;
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_3c8
                    );
          QList<ProString>::end(pQVar16);
          if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
            }
          }
          if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          QStringBuilder<ProString,_ProString>::~QStringBuilder
                    ((QStringBuilder<ProString,_ProString> *)local_2d8);
          if ((UnixMakefileGenerator *)local_608._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_608._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                     super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                          super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                         super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_4a8._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo =
                 *(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                          _vptr_QMakeSourceFileInfo + -1;
            UNLOCK();
            if (*(int *)&(((MakefileGenerator *)local_4a8._0_8_)->super_QMakeSourceFileInfo).
                         _vptr_QMakeSourceFileInfo == 0) {
              QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
            }
          }
          if ((UnixMakefileGenerator *)local_558._0_8_ != (UnixMakefileGenerator *)0x0) {
            LOCK();
            ((__atomic_base<int> *)
            &(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
             _vptr_QMakeSourceFileInfo)->_M_i =
                 ((__atomic_base<int> *)
                 &(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                  _vptr_QMakeSourceFileInfo)->_M_i + -1;
            iVar2 = ((__atomic_base<int> *)
                    &(((MakefileGenerator *)local_558._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo)->_M_i;
            UNLOCK();
            pUVar27 = (UnixMakefileGenerator *)local_558._0_8_;
            goto joined_r0x001da541;
          }
        }
      }
      pQVar26 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_LFLAGS_VERSION");
      bVar12 = QMakeProject::isEmpty(pQVar26,(ProKey *)local_2d8);
      if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
        LOCK();
        *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo =
             *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                      _vptr_QMakeSourceFileInfo + -1;
        UNLOCK();
        if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                     _vptr_QMakeSourceFileInfo == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      if (!bVar12) {
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_c8,"QMAKE_LFLAGS_VERSION");
        QMakeEvaluator::first(&local_98,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_c8);
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_128,"VER_MAJ");
        QMakeEvaluator::first
                  ((ProString *)(local_128 + 0x30),&pQVar26->super_QMakeEvaluator,
                   (ProKey *)local_128);
        ProString::ProString((ProString *)local_608,&local_98);
        ProString::ProString(local_5d8,(ProString *)(local_128 + 0x30));
        ProString::ProString((ProString *)local_558,(ProString *)local_608);
        ProString::ProString(&local_528,local_5d8);
        local_4f8 = (char (*) [2])0x2b339e;
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_188,"VER_MIN");
        QMakeEvaluator::first(&local_158,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_188);
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
        ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_4a8,
                         (QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]> *)
                         local_558,&local_158);
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
        ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_3c8,
                         (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_4a8);
        local_330 = (Data *)0x2b339e;
        pQVar26 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_7a8,"VER_PAT");
        QMakeEvaluator::first(&local_1b8,&pQVar26->super_QMakeEvaluator,(ProKey *)&local_7a8);
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
        ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_2d8,
                         (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_3c8);
        local_240._0_8_ = local_330;
        ProString::ProString((ProString *)(local_240 + 8),&local_1b8);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
        ::convertTo<QString>
                  (&local_808.m_string,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                    *)local_2d8);
        ProString::ProString(&local_68,&local_808.m_string);
        pQVar26 = *ppQVar1;
        ProKey::ProKey(&local_7d8,"QMAKE_LFLAGS");
        pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,&local_7d8)->
                   super_QList<ProString>;
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,&local_68);
        QList<ProString>::end(pQVar16);
        if (&(local_7d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_7d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_68.m_string.d.d != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                   super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                        super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)&(local_68.m_string.d.d)->super_QArrayData)->
                       super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_808.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_808.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_2d8);
        if (&(local_1b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_1b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_1b8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_7a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_7a8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_3c8);
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8);
        if (&(local_158.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_158.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QStringBuilder<ProString,_ProString>::~QStringBuilder
                  ((QStringBuilder<ProString,_ProString> *)local_558);
        QStringBuilder<ProString,_ProString>::~QStringBuilder
                  ((QStringBuilder<ProString,_ProString> *)local_608);
        if ((QArrayData *)local_128._48_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_128._48_8_)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_128._48_8_,2,0x10);
          }
        }
        if ((UnixMakefileGenerator *)local_128._0_8_ != (UnixMakefileGenerator *)0x0) {
          LOCK();
          *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo =
               *(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&(((MakefileGenerator *)local_128._0_8_)->super_QMakeSourceFileInfo).
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
          }
        }
        if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    pQVar26 = *ppQVar1;
    pcVar25 = "QMAKE_LFLAGS_SONAME";
  }
  else {
    ProKey::ProKey((ProKey *)local_2d8,"QMAKE_CFLAGS_APP");
    pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
    pQVar26 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CFLAGS");
    pPVar24 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
    pPVar19 = (pPVar17->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar24,pPVar19,
               pPVar19 + (pPVar17->super_QList<ProString>).d.size);
    if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
      }
    }
    pQVar26 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_2d8,"QMAKE_CXXFLAGS_APP");
    pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
    pQVar26 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CXXFLAGS");
    pPVar24 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
    pPVar19 = (pPVar17->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar24,pPVar19,
               pPVar19 + (pPVar17->super_QList<ProString>).d.size);
    if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
      }
    }
    pQVar26 = *ppQVar1;
    pcVar25 = "QMAKE_LFLAGS_APP";
  }
  ProKey::ProKey((ProKey *)local_2d8,pcVar25);
  pPVar17 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_2d8);
  pQVar26 = *ppQVar1;
  ProKey::ProKey((ProKey *)local_3c8,"QMAKE_LFLAGS");
  pPVar24 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8);
  pPVar19 = (pPVar17->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)pPVar24,pPVar19,
             pPVar19 + (pPVar17->super_QList<ProString>).d.size);
  if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
    LOCK();
    *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
             _vptr_QMakeSourceFileInfo =
         *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                  _vptr_QMakeSourceFileInfo + -1;
    UNLOCK();
    if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo == 0) {
      QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
    }
  }
  if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
    LOCK();
    *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
             _vptr_QMakeSourceFileInfo =
         *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                  _vptr_QMakeSourceFileInfo + -1;
    UNLOCK();
    if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                 _vptr_QMakeSourceFileInfo == 0) {
      QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
    }
  }
LAB_001daa4d:
  bVar12 = this->include_deps;
  if (bVar12 == true) {
    pQVar26 = *ppQVar1;
    QVar42.m_data = (storage_type *)0xe;
    QVar42.m_size = (qsizetype)local_2d8;
    QString::fromUtf8(QVar42);
    this = (UnixMakefileGenerator *)local_2d8._0_8_;
    config_16.m_data = (storage_type_conflict *)local_2d8._8_8_;
    config_16.m_size = local_2d8._16_8_;
    bVar15 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config_16,false);
  }
  else {
    bVar15 = false;
  }
  if ((bVar12 & this != (UnixMakefileGenerator *)0x0) == 1) {
    LOCK();
    ((__atomic_base<int> *)
    &(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo)->_M_i =
         ((__atomic_base<int> *)
         &(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo)->_M_i
         + -1;
    UNLOCK();
    if (((__atomic_base<int> *)
        &(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo)->_M_i
        == 0) {
      QArrayData::deallocate((QArrayData *)this,2,0x10);
    }
  }
  if (bVar15 != false) {
    local_2d8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_2b0 = (QMakeLocalFileName *)&DAT_aaaaaaaaaaaaaaaa;
    local_2d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_2d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_2d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_2d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ProString::ProString((ProString *)local_2d8,"-MD");
    pQVar26 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CFLAGS");
    pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8)->
               super_QList<ProString>;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
              ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_2d8);
    QList<ProString>::end(pQVar16);
    if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    pQVar26 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CXXFLAGS");
    pQVar16 = &QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_3c8)->
               super_QList<ProString>;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
              ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_2d8);
    QList<ProString>::end(pQVar16);
    if ((UnixMakefileGenerator *)local_3c8._0_8_ != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)local_3c8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if ((UnixMakefileGenerator *)local_2d8._0_8_ != (UnixMakefileGenerator *)0x0) {
      LOCK();
      *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
               _vptr_QMakeSourceFileInfo =
           *(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                    _vptr_QMakeSourceFileInfo + -1;
      UNLOCK();
      if (*(int *)&(((MakefileGenerator *)local_2d8._0_8_)->super_QMakeSourceFileInfo).
                   _vptr_QMakeSourceFileInfo == 0) {
        QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void UnixMakefileGenerator::init2()
{
    if(project->isEmpty("QMAKE_FRAMEWORK_VERSION"))
        project->values("QMAKE_FRAMEWORK_VERSION").append(project->first("VER_MAJ"));

    if (project->first("TEMPLATE") == "aux") {
        project->values("PRL_TARGET") = {
            project->first("QMAKE_PREFIX_STATICLIB") +
            project->first("TARGET")
        };
    } else if (!project->values("QMAKE_APP_FLAG").isEmpty()) {
        if(!project->isEmpty("QMAKE_BUNDLE")) {
            ProString bundle_loc = project->first("QMAKE_BUNDLE_LOCATION");
            if(!bundle_loc.isEmpty() && !bundle_loc.startsWith("/"))
                bundle_loc.prepend("/");
            if(!bundle_loc.endsWith("/"))
                bundle_loc += "/";
            project->values("TARGET").first().prepend(project->first("QMAKE_BUNDLE") + bundle_loc);
        }
        if(!project->isEmpty("TARGET"))
            project->values("TARGET").first().prepend(project->first("DESTDIR"));
    } else if (project->isActiveConfig("staticlib")) {
        project->values("PRL_TARGET") =
            project->values("TARGET").first().prepend(project->first("QMAKE_PREFIX_STATICLIB"));
        project->values("TARGET").first() += "." + project->first("QMAKE_EXTENSION_STATICLIB");
        if(project->values("QMAKE_AR_CMD").isEmpty())
            project->values("QMAKE_AR_CMD").append("$(AR) $(DESTDIR)$(TARGET) $(OBJECTS)");
    } else {
        project->values("TARGETA").append(project->first("DESTDIR") + project->first("QMAKE_PREFIX_STATICLIB")
                + project->first("TARGET") + "." + project->first("QMAKE_EXTENSION_STATICLIB"));

        ProStringList &ar_cmd = project->values("QMAKE_AR_CMD");
        if (!ar_cmd.isEmpty())
            ar_cmd[0] = ar_cmd.at(0).toQString().replace(QLatin1String("(TARGET)"), QLatin1String("(TARGETA)"));
        else
            ar_cmd.append("$(AR) $(TARGETA) $(OBJECTS)");
        if (!project->isEmpty("QMAKE_BUNDLE")) {
            project->values("PRL_TARGET").prepend(project->first("QMAKE_BUNDLE") +
                "/Versions/" + project->first("QMAKE_FRAMEWORK_VERSION") +
                "/Resources/" + project->first("TARGET"));
            ProString bundle_loc = project->first("QMAKE_BUNDLE_LOCATION");
            if(!bundle_loc.isEmpty() && !bundle_loc.startsWith("/"))
                bundle_loc.prepend("/");
            if(!bundle_loc.endsWith("/"))
                bundle_loc += "/";
            const QString target = project->first("QMAKE_BUNDLE") +
                                        bundle_loc + project->first("TARGET");
            project->values("TARGET_").append(target);
            if (!project->isActiveConfig("shallow_bundle")) {
                project->values("TARGET_x.y").append(project->first("QMAKE_BUNDLE") +
                                                          "/Versions/" +
                                                          project->first("QMAKE_FRAMEWORK_VERSION") +
                                                          bundle_loc + project->first("TARGET"));
            } else {
                project->values("TARGET_x.y").append(target);
            }
        } else if(project->isActiveConfig("plugin")) {
            QString prefix;
            if(!project->isActiveConfig("no_plugin_name_prefix"))
                prefix = "lib";
            project->values("PRL_TARGET").prepend(prefix + project->first("TARGET"));
            project->values("TARGET_x.y.z").append(prefix +
                                                        project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_PLUGIN"));
            if(project->isActiveConfig("lib_version_first"))
                project->values("TARGET_x").append(prefix + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ") + "." +
                                                        project->first("QMAKE_EXTENSION_PLUGIN"));
            else
                project->values("TARGET_x").append(prefix + project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_PLUGIN") +
                                                        "." + project->first("VER_MAJ"));
            project->values("TARGET") = project->values("TARGET_x.y.z");
        } else if (!project->isEmpty("QMAKE_HPUX_SHLIB")) {
            project->values("PRL_TARGET").prepend("lib" + project->first("TARGET"));
            project->values("TARGET_").append("lib" + project->first("TARGET") + ".sl");
            if(project->isActiveConfig("lib_version_first"))
                project->values("TARGET_x").append("lib" + project->first("VER_MAJ") + "." +
                                                        project->first("TARGET"));
            else
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ"));
            project->values("TARGET") = project->values("TARGET_x");
        } else if (!project->isEmpty("QMAKE_AIX_SHLIB")) {
            project->values("PRL_TARGET").prepend("lib" + project->first("TARGET"));
            project->values("TARGET_").append(project->first("QMAKE_PREFIX_STATICLIB") + project->first("TARGET")
                    + "." + project->first("QMAKE_EXTENSION_STATICLIB"));
            if(project->isActiveConfig("lib_version_first")) {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                          project->first("VER_MAJ") +
                                                          "." + project->first("VER_MIN") + "." +
                                                          project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") + "." +
                                                            project->first("VER_PAT") + "." +
                                                            project->first("QMAKE_EXTENSION_SHLIB"));
            } else {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB") +
                                                        "." + project->first("VER_MAJ"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                          project->first("QMAKE_EXTENSION_SHLIB") +
                                                          "." + project->first("VER_MAJ") +
                                                          "." + project->first("VER_MIN"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") + "." +
                                                            project->first("QMAKE_EXTENSION_SHLIB") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") + "." +
                                                            project->first("VER_PAT"));
            }
            project->values("TARGET") = project->values("TARGET_x.y.z");
        } else {
            project->values("PRL_TARGET").prepend("lib" + project->first("TARGET"));
            project->values("TARGET_").append("lib" + project->first("TARGET") + "." +
                                                   project->first("QMAKE_EXTENSION_SHLIB"));
            if(project->isActiveConfig("lib_version_first")) {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                          project->first("VER_MAJ") +
                                                          "." + project->first("VER_MIN") + "." +
                                                          project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") +  "." +
                                                            project->first("VER_PAT") + "." +
                                                            project->first("QMAKE_EXTENSION_SHLIB"));
            } else {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB") +
                                                        "." + project->first("VER_MAJ"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                      project->first("QMAKE_EXTENSION_SHLIB")
                                                      + "." + project->first("VER_MAJ") +
                                                      "." + project->first("VER_MIN"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") +
                                                            "." +
                                                            project->first(
                                                                "QMAKE_EXTENSION_SHLIB") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") +  "." +
                                                            project->first("VER_PAT"));
            }
            if (project->isActiveConfig("unversioned_libname"))
                project->values("TARGET") = project->values("TARGET_");
            else
                project->values("TARGET") = project->values("TARGET_x.y.z");
        }
        if (!project->values("QMAKE_LFLAGS_SONAME").isEmpty()) {
            ProString soname;
            if(project->isActiveConfig("plugin")) {
                if(!project->values("TARGET").isEmpty())
                    soname += project->first("TARGET");
            } else if(!project->isEmpty("QMAKE_BUNDLE")) {
                soname += project->first("TARGET_x.y");
            } else if(project->isActiveConfig("unversioned_soname")) {
                soname = "lib" + project->first("QMAKE_ORIG_TARGET")
                    + "." + project->first("QMAKE_EXTENSION_SHLIB");
            } else if(!project->values("TARGET_x").isEmpty()) {
                soname += project->first("TARGET_x");
            }
            if(!soname.isEmpty()) {
                if(project->isActiveConfig("absolute_library_soname") &&
                   project->values("INSTALLS").indexOf("target") != -1 &&
                   !project->isEmpty("target.path")) {
                    QString instpath = Option::fixPathToTargetOS(project->first("target.path").toQString());
                    if(!instpath.endsWith(Option::dir_sep))
                        instpath += Option::dir_sep;
                    soname.prepend(instpath);
                } else if (!project->isEmpty("QMAKE_SONAME_PREFIX")) {
                    QString sonameprefix = project->first("QMAKE_SONAME_PREFIX").toQString();
                    if (!sonameprefix.startsWith('@'))
                        sonameprefix = Option::fixPathToTargetOS(sonameprefix, false);
                    if (!sonameprefix.endsWith(Option::dir_sep))
                        sonameprefix += Option::dir_sep;
                    soname.prepend(sonameprefix);
                }
                project->values("QMAKE_LFLAGS_SONAME").first() += escapeFilePath(soname);
            }
        }
        if (project->values("QMAKE_LINK_SHLIB_CMD").isEmpty())
            project->values("QMAKE_LINK_SHLIB_CMD").append(
                "$(LINK) $(LFLAGS) " + project->first("QMAKE_LINK_O_FLAG") + "$(TARGET) $(OBJECTS) $(LIBS) $(OBJCOMP)");
    }
    if (!project->values("QMAKE_APP_FLAG").isEmpty() || project->first("TEMPLATE") == "aux") {
        project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_APP");
        project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_APP");
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_APP");
    } else if (project->isActiveConfig("dll")) {
        if(!project->isActiveConfig("plugin") || !project->isActiveConfig("plugin_no_share_shlib_cflags")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_SHLIB");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_SHLIB");
        }
        if (project->isActiveConfig("plugin")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_PLUGIN");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_PLUGIN");
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_PLUGIN");
            if (project->isActiveConfig("plugin_with_soname"))
                project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SONAME");
        } else {
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SHLIB");
            if(!project->isEmpty("QMAKE_LFLAGS_COMPAT_VERSION")) {
                if(project->isEmpty("COMPAT_VERSION"))
                    project->values("QMAKE_LFLAGS") += QString(project->first("QMAKE_LFLAGS_COMPAT_VERSION") +
                                                                    project->first("VER_MAJ") + "." +
                                                                    project->first("VER_MIN"));
                else
                    project->values("QMAKE_LFLAGS") += QString(project->first("QMAKE_LFLAGS_COMPAT_VERSION") +
                                                                    project->first("COMPATIBILITY_VERSION"));
            }
            if(!project->isEmpty("QMAKE_LFLAGS_VERSION")) {
                project->values("QMAKE_LFLAGS") += QString(project->first("QMAKE_LFLAGS_VERSION") +
                                                                project->first("VER_MAJ") + "." +
                                                                project->first("VER_MIN") + "." +
                                                                project->first("VER_PAT"));
            }
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SONAME");
        }
    }

    if (include_deps && project->isActiveConfig("gcc_MD_depends")) {
        ProString MD_flag("-MD");
        project->values("QMAKE_CFLAGS") += MD_flag;
        project->values("QMAKE_CXXFLAGS") += MD_flag;
    }
}